

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::LayerNorm_x86_avx::forward_inplace(LayerNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  long lVar18;
  undefined1 (*pauVar19) [32];
  float *pfVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  float *pfVar24;
  uint uVar25;
  ulong uVar26;
  float *pfVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  float *pfVar32;
  uint uVar33;
  ulong uVar34;
  undefined1 (*pauVar35) [32];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar69;
  float fVar70;
  __m128 _high;
  undefined1 auVar41 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar71;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar55 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar112;
  __m128 _a_128_3;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar113;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float _a;
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar117 [16];
  undefined1 auVar126 [16];
  float fVar140;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar122 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar137 [32];
  float fVar138;
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 in_ZMM2 [64];
  float _b;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar150 [32];
  undefined1 auVar146 [16];
  undefined1 auVar151 [32];
  undefined1 auVar147 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [64];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 in_ZMM6 [64];
  __m128 _low;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar181 [64];
  undefined1 auVar183 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  float fVar199;
  float fVar200;
  __m128 _a_128;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar193 [28];
  float fVar201;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar194 [28];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [28];
  undefined1 auVar196 [32];
  undefined1 auVar202 [36];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 in_ZMM10 [64];
  __m128 _low_1;
  undefined1 auVar223 [16];
  undefined1 auVar229 [32];
  undefined1 auVar224 [16];
  undefined1 auVar231 [32];
  undefined1 auVar225 [16];
  undefined1 auVar233 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar234 [64];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [64];
  ulong local_f8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 auVar136 [32];
  undefined1 auVar182 [64];
  undefined1 auVar184 [64];
  undefined1 auVar180 [32];
  undefined1 auVar228 [32];
  undefined1 auVar230 [32];
  undefined1 auVar232 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  
  auVar123 = in_ZMM14._0_16_;
  iVar22 = bottom_top_blob->elempack;
  iVar21 = bottom_top_blob->dims;
  iVar1 = bottom_top_blob->w;
  pp_Var2 = this->_vptr_LayerNorm_x86_avx;
  p_Var3 = pp_Var2[-3];
  pfVar32 = *(float **)(&this->field_0xe0 + (long)p_Var3);
  pfVar24 = *(float **)(&this->field_0x128 + (long)p_Var3);
  if (iVar21 == 1) {
    uVar30 = iVar1 * iVar22;
    pauVar35 = (undefined1 (*) [32])bottom_top_blob->data;
    pauVar19 = pauVar35;
    if ((int)uVar30 < 8) {
      uVar23 = 0;
      auVar67 = ZEXT832(0);
    }
    else {
      uVar23 = uVar30 & 0x7ffffff8;
      auVar167 = ZEXT864(0);
      iVar22 = 8;
      do {
        auVar67._0_4_ = auVar167._0_4_ + *(float *)*pauVar19;
        auVar67._4_4_ = auVar167._4_4_ + *(float *)(*pauVar19 + 4);
        auVar67._8_4_ = auVar167._8_4_ + *(float *)(*pauVar19 + 8);
        auVar67._12_4_ = auVar167._12_4_ + *(float *)(*pauVar19 + 0xc);
        auVar67._16_4_ = auVar167._16_4_ + *(float *)(*pauVar19 + 0x10);
        auVar67._20_4_ = auVar167._20_4_ + *(float *)(*pauVar19 + 0x14);
        auVar67._24_4_ = auVar167._24_4_ + *(float *)(*pauVar19 + 0x18);
        auVar67._28_4_ = auVar167._28_4_ + *(float *)(*pauVar19 + 0x1c);
        auVar167 = ZEXT3264(auVar67);
        pauVar19 = pauVar19 + 1;
        iVar22 = iVar22 + 8;
      } while (iVar22 <= (int)uVar30);
    }
    uVar29 = uVar23 | 4;
    auVar92 = ZEXT816(0) << 0x40;
    while( true ) {
      fVar36 = auVar92._4_4_;
      fVar38 = auVar92._8_4_;
      fVar69 = auVar92._12_4_;
      if ((int)uVar30 < (int)uVar29) break;
      auVar92._0_4_ = auVar92._0_4_ + *(float *)*pauVar19;
      auVar92._4_4_ = fVar36 + *(float *)(*pauVar19 + 4);
      auVar92._8_4_ = fVar38 + *(float *)(*pauVar19 + 8);
      auVar92._12_4_ = fVar69 + *(float *)(*pauVar19 + 0xc);
      pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
      uVar29 = uVar23 + 8;
      uVar23 = uVar23 + 4;
    }
    fVar70 = 0.0;
    if ((int)uVar23 < (int)uVar30) {
      uVar34 = CONCAT44(0,~uVar23 + uVar30);
      auVar123._8_8_ = 0;
      auVar123._0_8_ = uVar34;
      auVar56 = vpshufd_avx(auVar123,0x44);
      uVar28 = 0;
      auVar161._8_8_ = 0x8000000000000000;
      auVar161._0_8_ = 0x8000000000000000;
      auVar149 = vorps_avx(auVar56,auVar161);
      auVar93 = vorps_avx(auVar56,auVar161);
      auVar144 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
      auVar171 = vorps_avx(auVar56,auVar161);
      auVar167 = ZEXT1664((undefined1  [16])0x0);
      do {
        auVar266 = auVar167;
        auVar209._8_8_ = 0;
        auVar209._0_8_ = uVar28;
        auVar123 = vpshufd_avx(auVar209,0x44);
        auVar235._16_16_ = auVar123;
        auVar235._0_16_ = auVar123;
        auVar68 = vorps_avx(auVar235,_DAT_00557bc0);
        auVar235 = vorps_avx(auVar235,_DAT_00557be0);
        auVar242._0_8_ = auVar235._16_8_ ^ 0x8000000000000000;
        auVar242._8_4_ = auVar235._24_4_;
        auVar242._12_4_ = auVar235._28_4_ ^ 0x80000000;
        auVar209 = vpcmpgtq_avx(auVar242,auVar149);
        auVar258._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
        auVar258._8_4_ = auVar235._8_4_;
        auVar258._12_4_ = auVar235._12_4_ ^ 0x80000000;
        auVar123 = vpcmpgtq_avx(auVar258,auVar93);
        auVar124 = vpackssdw_avx(auVar123,auVar209);
        auVar259._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
        auVar259._8_4_ = auVar68._24_4_;
        auVar259._12_4_ = auVar68._28_4_ ^ 0x80000000;
        auVar123 = vpcmpgtq_avx(auVar259,auVar149);
        auVar148._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
        auVar148._8_4_ = auVar68._8_4_;
        auVar148._12_4_ = auVar68._12_4_ ^ 0x80000000;
        auVar148 = vpcmpgtq_avx(auVar148,auVar171);
        auVar148 = vpackssdw_avx(auVar148,auVar123);
        auVar124 = vpackssdw_avx(auVar144 ^ auVar148,auVar124 ^ auVar144);
        auVar148 = vpmovsxwd_avx(auVar124);
        auVar124 = vpunpckhwd_avx(auVar124,auVar124);
        auVar153._16_16_ = auVar124;
        auVar153._0_16_ = auVar148;
        auVar153 = vmaskmovps_avx(auVar153,*(undefined1 (*) [32])(*pauVar19 + uVar28 * 4));
        auVar124._0_4_ = auVar153._0_4_ + auVar266._0_4_;
        auVar124._4_4_ = auVar153._4_4_ + auVar266._4_4_;
        auVar124._8_4_ = auVar153._8_4_ + auVar266._8_4_;
        auVar124._12_4_ = auVar153._12_4_ + auVar266._12_4_;
        auVar136._16_4_ = auVar153._16_4_ + auVar266._16_4_;
        auVar136._0_16_ = auVar124;
        auVar136._20_4_ = auVar153._20_4_ + auVar266._20_4_;
        auVar136._24_4_ = auVar153._24_4_ + auVar266._24_4_;
        auVar136._28_4_ = auVar153._28_4_ + auVar266._28_4_;
        uVar28 = uVar28 + 8;
        auVar167 = ZEXT3264(auVar136);
      } while ((uVar34 + 8 & 0x1fffffff8) != uVar28);
      auVar149 = vorps_avx(auVar56,auVar161);
      auVar171._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
      auVar171._8_4_ = auVar235._8_4_;
      auVar171._12_4_ = auVar235._12_4_ ^ 0x80000000;
      auVar149 = vpcmpgtq_avx(auVar171,auVar149);
      auVar93 = vpackssdw_avx(auVar149,auVar209);
      auVar171 = vpcmpeqd_avx(auVar171,auVar171);
      auVar149 = vorps_avx(auVar56,auVar161);
      auVar144._8_4_ = auVar68._8_4_;
      auVar144._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
      auVar144._12_4_ = auVar68._12_4_ ^ 0x80000000;
      auVar149 = vpcmpgtq_avx(auVar144,auVar149);
      auVar149 = vpackssdw_avx(auVar149,auVar123);
      auVar149 = vblendvps_avx(auVar266._0_16_,auVar124,auVar149 ^ auVar171);
      auVar93 = vblendvps_avx(auVar266._16_16_,auVar136._16_16_,auVar93 ^ auVar171);
      auVar149 = vhaddps_avx(auVar93,auVar149);
      auVar149 = vhaddps_avx(auVar149,auVar149);
      auVar149 = vhaddps_avx(auVar149,auVar149);
      fVar70 = auVar149._0_4_;
    }
    auVar149 = vshufpd_avx(auVar92,auVar92,1);
    auVar93._0_4_ = auVar149._0_4_ + auVar92._0_4_;
    auVar93._4_4_ = auVar149._4_4_ + fVar36;
    auVar93._8_4_ = auVar149._8_4_ + fVar38;
    auVar93._12_4_ = auVar149._12_4_ + fVar69;
    auVar92 = vhaddps_avx(auVar67._16_16_,auVar67._0_16_);
    auVar149 = vmovshdup_avx(auVar93);
    auVar92 = vhaddps_avx(auVar92,auVar92);
    auVar92 = vhaddps_avx(auVar92,auVar92);
    fVar36 = (auVar92._0_4_ + auVar149._0_4_ + auVar93._0_4_ + fVar70) / (float)(int)uVar30;
    auVar92 = vshufps_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),0);
    pauVar19 = pauVar35;
    if ((int)uVar30 < 8) {
      uVar23 = 0;
      auVar137 = ZEXT1232(ZEXT812(0)) << 0x20;
    }
    else {
      auVar68._16_16_ = auVar92;
      auVar68._0_16_ = auVar92;
      uVar23 = uVar30 & 0x7ffffff8;
      auVar167 = ZEXT864(0) << 0x40;
      iVar22 = 8;
      do {
        auVar67 = vsubps_avx(*pauVar19,auVar68);
        auVar137._0_4_ = auVar67._0_4_ * auVar67._0_4_ + auVar167._0_4_;
        auVar137._4_4_ = auVar67._4_4_ * auVar67._4_4_ + auVar167._4_4_;
        auVar137._8_4_ = auVar67._8_4_ * auVar67._8_4_ + auVar167._8_4_;
        auVar137._12_4_ = auVar67._12_4_ * auVar67._12_4_ + auVar167._12_4_;
        auVar137._16_4_ = auVar67._16_4_ * auVar67._16_4_ + auVar167._16_4_;
        auVar137._20_4_ = auVar67._20_4_ * auVar67._20_4_ + auVar167._20_4_;
        auVar137._24_4_ = auVar67._24_4_ * auVar67._24_4_ + auVar167._24_4_;
        auVar137._28_4_ = auVar67._28_4_ + auVar167._28_4_;
        auVar167 = ZEXT3264(auVar137);
        pauVar19 = pauVar19 + 1;
        iVar22 = iVar22 + 8;
      } while (iVar22 <= (int)uVar30);
    }
    uVar29 = uVar23 | 4;
    auVar149 = ZEXT816(0) << 0x20;
    while( true ) {
      fVar38 = auVar149._4_4_;
      fVar69 = auVar149._8_4_;
      fVar70 = auVar149._12_4_;
      if ((int)uVar30 < (int)uVar29) break;
      auVar93 = vsubps_avx(*(undefined1 (*) [16])*pauVar19,auVar92);
      auVar149._0_4_ = auVar93._0_4_ * auVar93._0_4_ + auVar149._0_4_;
      auVar149._4_4_ = auVar93._4_4_ * auVar93._4_4_ + fVar38;
      auVar149._8_4_ = auVar93._8_4_ * auVar93._8_4_ + fVar69;
      auVar149._12_4_ = auVar93._12_4_ * auVar93._12_4_ + fVar70;
      pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
      uVar29 = uVar23 + 8;
      uVar23 = uVar23 + 4;
    }
    fVar71 = *(float *)(&this->field_0xd4 + (long)p_Var3);
    fVar37 = 0.0;
    if ((int)uVar23 < (int)uVar30) {
      uVar28 = CONCAT44(0,~uVar23 + uVar30);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar28;
      auVar144 = vpshufd_avx(auVar56,0x44);
      auVar196._16_16_ = auVar92;
      auVar196._0_16_ = auVar92;
      uVar34 = 0;
      auVar172._8_8_ = 0x8000000000000000;
      auVar172._0_8_ = 0x8000000000000000;
      auVar92 = vorps_avx(auVar144,auVar172);
      auVar93 = vorps_avx(auVar144,auVar172);
      auVar171 = vpcmpeqd_avx(auVar123,auVar123);
      auVar123 = vorps_avx(auVar144,auVar172);
      auVar167 = ZEXT1264(ZEXT812(0));
      do {
        auVar266 = auVar167;
        auVar94._8_8_ = 0;
        auVar94._0_8_ = uVar34;
        auVar56 = vpshufd_avx(auVar94,0x44);
        auVar111._16_16_ = auVar56;
        auVar111._0_16_ = auVar56;
        auVar67 = vorps_avx(auVar111,_DAT_00557bc0);
        auVar68 = vorps_avx(_DAT_00557be0,auVar111);
        auVar162._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
        auVar162._8_4_ = auVar68._24_4_;
        auVar162._12_4_ = auVar68._28_4_ ^ 0x80000000;
        auVar124 = vpcmpgtq_avx(auVar162,auVar92);
        auVar173._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
        auVar95._8_4_ = auVar68._8_4_;
        auVar173._8_4_ = auVar95._8_4_;
        auVar173._12_4_ = auVar68._12_4_ ^ 0x80000000;
        auVar56 = vpcmpgtq_avx(auVar173,auVar93);
        auVar56 = vpackssdw_avx(auVar56,auVar124);
        auVar174._0_8_ = auVar67._16_8_ ^ 0x8000000000000000;
        auVar174._8_4_ = auVar67._24_4_;
        auVar174._12_4_ = auVar67._28_4_ ^ 0x80000000;
        auVar148 = vpcmpgtq_avx(auVar174,auVar92);
        auVar210._0_8_ = auVar67._0_8_ ^ 0x8000000000000000;
        auVar210._8_4_ = auVar67._8_4_;
        auVar210._12_4_ = auVar67._12_4_ ^ 0x80000000;
        auVar161 = vpcmpgtq_avx(auVar210,auVar123);
        auVar161 = vpackssdw_avx(auVar161,auVar148);
        auVar56 = vpackssdw_avx(auVar161 ^ auVar171,auVar171 ^ auVar56);
        auVar161 = vpmovsxwd_avx(auVar56);
        auVar56 = vpunpckhwd_avx(auVar56,auVar56);
        auVar179._16_16_ = auVar56;
        auVar179._0_16_ = auVar161;
        auVar235 = vmaskmovps_avx(auVar179,*(undefined1 (*) [32])(*pauVar19 + uVar34 * 4));
        auVar235 = vsubps_avx(auVar235,auVar196);
        auVar178._0_4_ = auVar235._0_4_ * auVar235._0_4_ + auVar266._0_4_;
        auVar178._4_4_ = auVar235._4_4_ * auVar235._4_4_ + auVar266._4_4_;
        auVar178._8_4_ = auVar235._8_4_ * auVar235._8_4_ + auVar266._8_4_;
        auVar178._12_4_ = auVar235._12_4_ * auVar235._12_4_ + auVar266._12_4_;
        auVar180._16_4_ = auVar235._16_4_ * auVar235._16_4_ + auVar266._16_4_;
        auVar180._0_16_ = auVar178;
        auVar180._20_4_ = auVar235._20_4_ * auVar235._20_4_ + auVar266._20_4_;
        auVar180._24_4_ = auVar235._24_4_ * auVar235._24_4_ + auVar266._24_4_;
        auVar180._28_4_ = auVar235._28_4_ + auVar266._28_4_;
        uVar34 = uVar34 + 8;
        auVar167 = ZEXT3264(auVar180);
      } while ((uVar28 + 8 & 0x1fffffff8) != uVar34);
      auVar123 = vorps_avx(auVar144,auVar172);
      auVar95._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
      auVar95._12_4_ = auVar68._12_4_ ^ 0x80000000;
      auVar123 = vpcmpgtq_avx(auVar95,auVar123);
      auVar92 = vpackssdw_avx(auVar123,auVar124);
      auVar93 = vpcmpeqd_avx(auVar124,auVar124);
      auVar123 = vorps_avx(auVar144,auVar172);
      auVar123 = vpcmpgtq_avx(auVar67._0_16_ ^ auVar172,auVar123);
      auVar123 = vpackssdw_avx(auVar123,auVar148);
      auVar123 = vblendvps_avx(auVar266._0_16_,auVar178,auVar123 ^ auVar93);
      auVar92 = vblendvps_avx(auVar266._16_16_,auVar180._16_16_,auVar92 ^ auVar93);
      auVar123 = vhaddps_avx(auVar92,auVar123);
      auVar123 = vhaddps_avx(auVar123,auVar123);
      auVar123 = vhaddps_avx(auVar123,auVar123);
      fVar37 = auVar123._0_4_;
    }
    fVar138 = 0.0;
    auVar123 = vhaddps_avx(auVar137._16_16_,auVar137._0_16_);
    auVar123 = vhaddps_avx(auVar123,auVar123);
    auVar92 = vshufpd_avx(auVar149,auVar149,1);
    auVar123 = vhaddps_avx(auVar123,auVar123);
    auVar125._0_4_ = auVar92._0_4_ + auVar149._0_4_;
    auVar125._4_4_ = auVar92._4_4_ + fVar38;
    auVar125._8_4_ = auVar92._8_4_ + fVar69;
    auVar125._12_4_ = auVar92._12_4_ + fVar70;
    auVar92 = vmovshdup_avx(auVar125);
    fVar38 = (auVar123._0_4_ + auVar92._0_4_ + auVar125._0_4_ + fVar37) / (float)(int)uVar30 +
             fVar71;
    auVar123 = vrsqrtss_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
    fVar69 = auVar123._0_4_;
    fVar37 = fVar69 * -0.5 * (fVar38 * fVar69 * fVar69 + -3.0);
    fVar114 = 0.0;
    fVar199 = fVar37 * -fVar36;
    auVar123 = vshufps_avx(ZEXT416((uint)fVar37),ZEXT416((uint)fVar37),0);
    auVar92 = vshufps_avx(ZEXT416((uint)fVar199),ZEXT416((uint)fVar199),0);
    uVar23 = 0;
    fVar200 = auVar123._0_4_;
    fVar201 = auVar123._4_4_;
    fVar112 = auVar123._8_4_;
    fVar113 = auVar123._12_4_;
    fVar36 = auVar92._0_4_;
    fVar38 = auVar92._4_4_;
    fVar69 = auVar92._8_4_;
    fVar70 = auVar92._12_4_;
    if (*(int *)(&this->field_0xd8 + (long)p_Var3) == 0) {
      if (7 < (int)uVar30) {
        uVar23 = uVar30 & 0x7ffffff8;
        iVar22 = 8;
        do {
          fVar37 = *(float *)(*pauVar35 + 4);
          fVar199 = *(float *)(*pauVar35 + 8);
          fVar138 = *(float *)(*pauVar35 + 0xc);
          fVar139 = *(float *)(*pauVar35 + 0x10);
          fVar140 = *(float *)(*pauVar35 + 0x14);
          fVar141 = *(float *)(*pauVar35 + 0x18);
          fVar114 = fVar114 + fVar70;
          *(float *)*pauVar35 = fVar200 * *(float *)*pauVar35 + fVar36;
          *(float *)(*pauVar35 + 4) = fVar201 * fVar37 + fVar38;
          *(float *)(*pauVar35 + 8) = fVar112 * fVar199 + fVar69;
          *(float *)(*pauVar35 + 0xc) = fVar113 * fVar138 + fVar70;
          *(float *)(*pauVar35 + 0x10) = fVar200 * fVar139 + fVar36;
          *(float *)(*pauVar35 + 0x14) = fVar201 * fVar140 + fVar38;
          *(float *)(*pauVar35 + 0x18) = fVar112 * fVar141 + fVar69;
          *(float *)(*pauVar35 + 0x1c) = fVar114;
          pauVar35 = pauVar35 + 1;
          iVar22 = iVar22 + 8;
        } while (iVar22 <= (int)uVar30);
      }
      uVar29 = uVar23 | 4;
      auVar67 = _DAT_00557bc0;
      auVar68 = _DAT_00557be0;
      while (_DAT_00557bc0 = auVar67, _DAT_00557be0 = auVar68, (int)uVar29 <= (int)uVar30) {
        fVar37 = *(float *)(*pauVar35 + 4);
        fVar199 = *(float *)(*pauVar35 + 8);
        fVar114 = *(float *)(*pauVar35 + 0xc);
        *(float *)*pauVar35 = fVar200 * *(float *)*pauVar35 + fVar36;
        *(float *)(*pauVar35 + 4) = fVar201 * fVar37 + fVar38;
        *(float *)(*pauVar35 + 8) = fVar112 * fVar199 + fVar69;
        *(float *)(*pauVar35 + 0xc) = fVar113 * fVar114 + fVar70;
        pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
        uVar29 = uVar23 + 8;
        uVar23 = uVar23 + 4;
        auVar67 = _DAT_00557bc0;
        auVar68 = _DAT_00557be0;
      }
      if ((int)uVar23 < (int)uVar30) {
        uVar28 = CONCAT44(0,uVar30 + ~uVar23);
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar28;
        auVar149 = vpshufd_avx(auVar126,0x44);
        uVar34 = 0;
        auVar163._8_8_ = 0x8000000000000000;
        auVar163._0_8_ = 0x8000000000000000;
        auVar123 = vorps_avx(auVar149,auVar163);
        auVar92 = vorps_avx(auVar149,auVar163);
        auVar93 = vpcmpeqd_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71));
        auVar149 = vorps_avx(auVar149,auVar163);
        do {
          auVar211._8_8_ = 0;
          auVar211._0_8_ = uVar34;
          auVar171 = vpshufd_avx(auVar211,0x44);
          auVar213._16_16_ = auVar171;
          auVar213._0_16_ = auVar171;
          auVar235 = vorps_avx(auVar213,auVar67);
          auVar153 = vorps_avx(auVar213,auVar68);
          auVar226._0_8_ = auVar153._16_8_ ^ 0x8000000000000000;
          auVar226._8_4_ = auVar153._24_4_;
          auVar226._12_4_ = auVar153._28_4_ ^ 0x80000000;
          auVar171 = vpcmpgtq_avx(auVar226,auVar123);
          auVar212._0_8_ = auVar153._0_8_ ^ 0x8000000000000000;
          auVar212._8_4_ = auVar153._8_4_;
          auVar212._12_4_ = auVar153._12_4_ ^ 0x80000000;
          auVar144 = vpcmpgtq_avx(auVar212,auVar92);
          auVar171 = vpackssdw_avx(auVar144,auVar171);
          auVar227._0_8_ = auVar235._16_8_ ^ 0x8000000000000000;
          auVar227._8_4_ = auVar235._24_4_;
          auVar227._12_4_ = auVar235._28_4_ ^ 0x80000000;
          auVar144 = vpcmpgtq_avx(auVar227,auVar123);
          auVar221._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
          auVar221._8_4_ = auVar235._8_4_;
          auVar221._12_4_ = auVar235._12_4_ ^ 0x80000000;
          auVar56 = vpcmpgtq_avx(auVar221,auVar149);
          auVar144 = vpackssdw_avx(auVar56,auVar144);
          auVar171 = vpackssdw_avx(auVar144 ^ auVar93,auVar171 ^ auVar93);
          auVar144 = vpmovsxwd_avx(auVar171);
          auVar171 = vpunpckhwd_avx(auVar171,auVar171);
          auVar214._16_16_ = auVar171;
          auVar214._0_16_ = auVar144;
          auVar235 = vmaskmovps_avx(auVar214,*(undefined1 (*) [32])(*pauVar35 + uVar34 * 4));
          auVar222._0_4_ = auVar235._0_4_ * fVar200 + fVar36;
          auVar222._4_4_ = auVar235._4_4_ * fVar201 + fVar38;
          auVar222._8_4_ = auVar235._8_4_ * fVar112 + fVar69;
          auVar222._12_4_ = auVar235._12_4_ * fVar113 + fVar70;
          auVar222._16_4_ = auVar235._16_4_ * fVar200 + fVar36;
          auVar222._20_4_ = auVar235._20_4_ * fVar201 + fVar38;
          auVar222._24_4_ = auVar235._24_4_ * fVar112 + fVar69;
          auVar222._28_4_ = auVar235._28_4_ + fVar70;
          auVar235 = vmaskmovps_avx(auVar214,auVar222);
          *(undefined1 (*) [32])(*pauVar35 + uVar34 * 4) = auVar235;
          uVar34 = uVar34 + 8;
        } while ((uVar28 + 8 & 0x1fffffff8) != uVar34);
      }
    }
    else {
      if (7 < (int)uVar30) {
        uVar23 = uVar30 & 0x7ffffff8;
        iVar22 = 8;
        do {
          fVar71 = *(float *)(*pauVar35 + 4);
          fVar114 = *(float *)(*pauVar35 + 8);
          fVar139 = *(float *)(*pauVar35 + 0xc);
          fVar140 = *(float *)(*pauVar35 + 0x10);
          fVar141 = *(float *)(*pauVar35 + 0x14);
          fVar142 = *(float *)(*pauVar35 + 0x18);
          fVar143 = pfVar32[1];
          fVar4 = pfVar32[2];
          fVar5 = pfVar32[3];
          fVar6 = pfVar32[4];
          fVar7 = pfVar32[5];
          fVar8 = pfVar32[6];
          fVar9 = pfVar24[1];
          fVar10 = pfVar24[2];
          fVar11 = pfVar24[3];
          fVar12 = pfVar24[4];
          fVar13 = pfVar24[5];
          fVar14 = pfVar24[6];
          fVar138 = fVar138 + fVar70 + pfVar24[7];
          *(float *)*pauVar35 = (fVar200 * *(float *)*pauVar35 + fVar36) * *pfVar32 + *pfVar24;
          *(float *)(*pauVar35 + 4) = (fVar201 * fVar71 + fVar38) * fVar143 + fVar9;
          *(float *)(*pauVar35 + 8) = (fVar112 * fVar114 + fVar69) * fVar4 + fVar10;
          *(float *)(*pauVar35 + 0xc) = (fVar113 * fVar139 + fVar70) * fVar5 + fVar11;
          *(float *)(*pauVar35 + 0x10) = (fVar200 * fVar140 + fVar36) * fVar6 + fVar12;
          *(float *)(*pauVar35 + 0x14) = (fVar201 * fVar141 + fVar38) * fVar7 + fVar13;
          *(float *)(*pauVar35 + 0x18) = (fVar112 * fVar142 + fVar69) * fVar8 + fVar14;
          *(float *)(*pauVar35 + 0x1c) = fVar138;
          pauVar35 = pauVar35 + 1;
          pfVar32 = pfVar32 + 8;
          pfVar24 = pfVar24 + 8;
          iVar22 = iVar22 + 8;
        } while (iVar22 <= (int)uVar30);
      }
      uVar29 = uVar23 | 4;
      while ((int)uVar29 <= (int)uVar30) {
        fVar71 = *(float *)(*pauVar35 + 4);
        fVar114 = *(float *)(*pauVar35 + 8);
        fVar138 = *(float *)(*pauVar35 + 0xc);
        fVar139 = pfVar32[1];
        fVar140 = pfVar32[2];
        fVar141 = pfVar32[3];
        fVar142 = pfVar24[1];
        fVar143 = pfVar24[2];
        fVar4 = pfVar24[3];
        *(float *)*pauVar35 = (fVar200 * *(float *)*pauVar35 + fVar36) * *pfVar32 + *pfVar24;
        *(float *)(*pauVar35 + 4) = (fVar201 * fVar71 + fVar38) * fVar139 + fVar142;
        *(float *)(*pauVar35 + 8) = (fVar112 * fVar114 + fVar69) * fVar140 + fVar143;
        *(float *)(*pauVar35 + 0xc) = (fVar113 * fVar138 + fVar70) * fVar141 + fVar4;
        pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
        pfVar32 = pfVar32 + 4;
        pfVar24 = pfVar24 + 4;
        uVar29 = uVar23 + 8;
        uVar23 = uVar23 + 4;
      }
      if (uVar30 - uVar23 != 0 && (int)uVar23 <= (int)uVar30) {
        lVar18 = 0;
        do {
          *(float *)(*pauVar35 + lVar18 * 4) =
               (fVar37 * *(float *)(*pauVar35 + lVar18 * 4) + fVar199) * pfVar32[lVar18] +
               pfVar24[lVar18];
          lVar18 = lVar18 + 1;
        } while (uVar30 - uVar23 != (int)lVar18);
      }
    }
  }
  else {
    uVar30 = bottom_top_blob->h;
    auVar123 = in_ZMM6._0_16_;
    if (iVar21 == 3) {
      uVar23 = bottom_top_blob->c;
      if (*(int *)(&this->field_0xd0 + (long)p_Var3) == iVar1) {
        if (0 < (int)uVar23) {
          uVar29 = iVar1 * iVar22;
          fVar36 = 1.0 / (float)iVar1;
          auVar92 = vshufps_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),0);
          uVar33 = uVar29 & 0xfffffff8;
          local_f8 = 0;
          auVar266 = ZEXT3264(_DAT_00557bc0);
          auVar167 = ZEXT3264(_DAT_00557be0);
          auVar169._8_8_ = 0x8000000000000000;
          auVar169._0_8_ = 0x8000000000000000;
          auVar123 = vpcmpeqd_avx(auVar123,auVar123);
          do {
            if (0 < (int)uVar30) {
              uVar34 = 0;
              do {
                pauVar35 = (undefined1 (*) [32])
                           ((long)bottom_top_blob->data +
                           (long)bottom_top_blob->w * uVar34 * bottom_top_blob->elemsize +
                           bottom_top_blob->cstep * local_f8 * bottom_top_blob->elemsize);
                pauVar19 = pauVar35;
                if ((int)uVar29 < 8) {
                  auVar181 = ZEXT864(0);
                  uVar25 = 0;
                }
                else {
                  auVar181 = ZEXT864(0);
                  iVar21 = 8;
                  do {
                    auVar181 = ZEXT3264(CONCAT428(auVar181._28_4_ + *(float *)(*pauVar19 + 0x1c),
                                                  CONCAT424(auVar181._24_4_ +
                                                            *(float *)(*pauVar19 + 0x18),
                                                            CONCAT420(auVar181._20_4_ +
                                                                      *(float *)(*pauVar19 + 0x14),
                                                                      CONCAT416(auVar181._16_4_ +
                                                                                *(float *)(*pauVar19
                                                                                          + 0x10),
                                                                                CONCAT412(auVar181.
                                                  _12_4_ + *(float *)(*pauVar19 + 0xc),
                                                  CONCAT48(auVar181._8_4_ +
                                                           *(float *)(*pauVar19 + 8),
                                                           CONCAT44(auVar181._4_4_ +
                                                                    *(float *)(*pauVar19 + 4),
                                                                    auVar181._0_4_ +
                                                                    *(float *)*pauVar19))))))));
                    pauVar19 = pauVar19 + 1;
                    iVar21 = iVar21 + 8;
                    uVar25 = uVar33;
                  } while (iVar21 <= (int)uVar29);
                }
                uVar31 = uVar25 | 4;
                auVar189 = ZEXT816(0) << 0x40;
                while( true ) {
                  fVar38 = auVar189._0_4_;
                  fVar69 = auVar189._4_4_;
                  fVar70 = auVar189._8_4_;
                  fVar71 = auVar189._12_4_;
                  if ((int)uVar29 < (int)uVar31) break;
                  auVar189._0_4_ = fVar38 + *(float *)*pauVar19;
                  auVar189._4_4_ = fVar69 + *(float *)(*pauVar19 + 4);
                  auVar189._8_4_ = fVar70 + *(float *)(*pauVar19 + 8);
                  auVar189._12_4_ = fVar71 + *(float *)(*pauVar19 + 0xc);
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
                  uVar31 = uVar25 + 8;
                  uVar25 = uVar25 + 4;
                }
                auVar149 = ZEXT816(0) << 0x20;
                fVar37 = 0.0;
                auVar67 = auVar266._0_32_;
                if ((int)uVar25 < (int)uVar29) {
                  uVar28 = CONCAT44(0,~uVar25 + uVar29);
                  auVar43._8_8_ = 0;
                  auVar43._0_8_ = uVar28;
                  auVar171 = vpshufd_avx(auVar43,0x44);
                  auVar149 = vorps_avx(auVar171,auVar169);
                  auVar93 = vorps_avx(auVar171,auVar169);
                  uVar26 = 0;
                  auVar154 = ZEXT1664(ZEXT816(0) << 0x40);
                  do {
                    auVar234 = auVar154;
                    auVar79._8_8_ = 0;
                    auVar79._0_8_ = uVar26;
                    auVar144 = vpshufd_avx(auVar79,0x44);
                    auVar101._16_16_ = auVar144;
                    auVar101._0_16_ = auVar144;
                    auVar68 = vorps_avx(auVar67,auVar101);
                    auVar235 = vorps_avx(auVar101,auVar167._0_32_);
                    auVar144 = vorps_avx(auVar171,auVar169);
                    auVar217._8_4_ = auVar235._24_4_;
                    auVar217._0_8_ = auVar235._16_8_ ^ 0x8000000000000000;
                    auVar217._12_4_ = auVar235._28_4_ ^ 0x80000000;
                    auVar161 = vpcmpgtq_avx(auVar217,auVar144);
                    auVar80._8_4_ = auVar235._8_4_;
                    auVar238._8_4_ = auVar80._8_4_;
                    auVar238._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
                    auVar238._12_4_ = auVar235._12_4_ ^ 0x80000000;
                    auVar56 = vpcmpgtq_avx(auVar238,auVar149);
                    auVar56 = vpackssdw_avx(auVar56,auVar161);
                    auVar250._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
                    auVar250._8_4_ = auVar68._24_4_;
                    auVar250._12_4_ = auVar68._28_4_ ^ 0x80000000;
                    auVar124 = vpcmpgtq_avx(auVar250,auVar144);
                    auVar251._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
                    auVar251._8_4_ = auVar68._8_4_;
                    auVar251._12_4_ = auVar68._12_4_ ^ 0x80000000;
                    auVar144 = vpcmpgtq_avx(auVar251,auVar93);
                    auVar144 = vpackssdw_avx(auVar144,auVar124);
                    auVar144 = vpackssdw_avx(auVar144 ^ auVar123,auVar56 ^ auVar123);
                    auVar56 = vpmovsxwd_avx(auVar144);
                    auVar144 = vpunpckhwd_avx(auVar144,auVar144);
                    auVar244._16_16_ = auVar144;
                    auVar244._0_16_ = auVar56;
                    auVar153 = vmaskmovps_avx(auVar244,*(undefined1 (*) [32])
                                                        (*pauVar19 + uVar26 * 4));
                    auVar224._0_4_ = auVar153._0_4_ + auVar234._0_4_;
                    auVar224._4_4_ = auVar153._4_4_ + auVar234._4_4_;
                    auVar224._8_4_ = auVar153._8_4_ + auVar234._8_4_;
                    auVar224._12_4_ = auVar153._12_4_ + auVar234._12_4_;
                    auVar230._16_4_ = auVar153._16_4_ + auVar234._16_4_;
                    auVar230._0_16_ = auVar224;
                    auVar230._20_4_ = auVar153._20_4_ + auVar234._20_4_;
                    auVar230._24_4_ = auVar153._24_4_ + auVar234._24_4_;
                    auVar230._28_4_ = auVar153._28_4_ + auVar234._28_4_;
                    uVar26 = uVar26 + 8;
                    auVar154 = ZEXT3264(auVar230);
                  } while ((uVar28 + 8 & 0x1fffffff8) != uVar26);
                  auVar149 = vorps_avx(auVar171,auVar169);
                  auVar80._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
                  auVar80._12_4_ = auVar235._12_4_ ^ 0x80000000;
                  auVar149 = vpcmpgtq_avx(auVar80,auVar149);
                  auVar93 = vpackssdw_avx(auVar149,auVar161);
                  auVar149 = vorps_avx(auVar171,auVar169);
                  auVar118._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
                  auVar118._8_4_ = auVar68._8_4_;
                  auVar118._12_4_ = auVar68._12_4_ ^ 0x80000000;
                  auVar149 = vpcmpgtq_avx(auVar118,auVar149);
                  auVar149 = vpackssdw_avx(auVar149,auVar124);
                  auVar149 = vblendvps_avx(auVar234._0_16_,auVar224,auVar149 ^ auVar123);
                  in_ZMM2 = ZEXT1664(auVar230._16_16_);
                  auVar93 = vblendvps_avx(auVar234._16_16_,auVar230._16_16_,auVar93 ^ auVar123);
                  auVar149 = vhaddps_avx(auVar93,auVar149);
                  auVar149 = vhaddps_avx(auVar149,auVar149);
                  auVar149 = vhaddps_avx(auVar149,auVar149);
                  fVar37 = auVar149._0_4_;
                  auVar149 = ZEXT816(0);
                }
                auVar154 = ZEXT1664(auVar149 << 0x20);
                local_d8 = auVar92._0_4_;
                fStack_d4 = auVar92._4_4_;
                fStack_d0 = auVar92._8_4_;
                fStack_cc = auVar92._12_4_;
                if (iVar22 == 8) {
                  auVar176._0_4_ = auVar181._0_4_ * local_d8;
                  auVar176._4_4_ = auVar181._4_4_ * fStack_d4;
                  auVar176._8_4_ = auVar181._8_4_ * fStack_d0;
                  auVar176._12_4_ = auVar181._12_4_ * fStack_cc;
                  auVar184._16_4_ = auVar181._16_4_ * local_d8;
                  auVar184._0_16_ = auVar176;
                  auVar184._20_4_ = auVar181._20_4_ * fStack_d4;
                  auVar184._28_36_ = auVar181._28_36_;
                  auVar184._24_4_ = auVar181._24_4_ * fStack_d0;
                  auVar60 = auVar184._0_32_;
                  auVar181 = ZEXT3264(auVar60);
                  auVar190 = vshufps_avx(auVar176,auVar176,0);
                  bVar15 = true;
                  bVar17 = false;
                  auVar154 = ZEXT1664(auVar176);
                  bVar16 = false;
                }
                else {
                  if (iVar22 == 4) {
                    auVar190._0_4_ = (fVar38 + auVar181._16_4_ + auVar181._0_4_) * local_d8;
                    auVar190._4_4_ = (fVar69 + auVar181._20_4_ + auVar181._4_4_) * fStack_d4;
                    auVar190._8_4_ = (fVar70 + auVar181._24_4_ + auVar181._8_4_) * fStack_d0;
                    auVar190._12_4_ = (fVar71 + auVar181._28_4_ + auVar181._12_4_) * fStack_cc;
                    bVar16 = true;
                    bVar17 = false;
                    auVar154 = ZEXT1664(auVar190);
                    auVar149 = auVar190;
                  }
                  else {
                    if (iVar22 != 1) {
                      auVar149 = ZEXT816(0);
                      auVar190 = ZEXT816(0) << 0x40;
                    }
                    else {
                      auVar93 = vshufpd_avx(auVar189,auVar189,1);
                      auVar149 = vhaddps_avx(auVar181._16_16_,auVar181._0_16_);
                      auVar119._0_4_ = fVar38 + auVar93._0_4_;
                      auVar119._4_4_ = fVar69 + auVar93._4_4_;
                      auVar119._8_4_ = fVar70 + auVar93._8_4_;
                      auVar119._12_4_ = fVar71 + auVar93._12_4_;
                      in_ZMM2 = ZEXT1664(auVar119);
                      auVar149 = vhaddps_avx(auVar149,auVar149);
                      auVar93 = vmovshdup_avx(auVar119);
                      auVar149 = vhaddps_avx(auVar149,auVar149);
                      fVar38 = (auVar149._0_4_ + auVar93._0_4_ + auVar119._0_4_ + fVar37) * fVar36;
                      auVar154 = ZEXT464((uint)fVar38);
                      auVar149 = vblendps_avx(ZEXT416((uint)fVar38),_DAT_005573b0,0xe);
                      auVar190 = vshufps_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38),0);
                    }
                    bVar17 = iVar22 == 1;
                    bVar16 = false;
                  }
                  auVar181 = ZEXT1664(auVar149);
                  auVar60._16_16_ = auVar190;
                  auVar60._0_16_ = auVar190;
                  bVar15 = false;
                }
                auVar202 = (undefined1  [36])0x0;
                pauVar19 = pauVar35;
                if ((int)uVar29 < 8) {
                  auVar231 = SUB6432(ZEXT864(0),0);
                  uVar25 = 0;
                }
                else {
                  auVar234 = ZEXT864(0);
                  iVar21 = 8;
                  do {
                    auVar68 = vsubps_avx(*pauVar19,auVar60);
                    auVar231._0_4_ = auVar234._0_4_ + auVar68._0_4_ * auVar68._0_4_;
                    auVar231._4_4_ = auVar234._4_4_ + auVar68._4_4_ * auVar68._4_4_;
                    auVar231._8_4_ = auVar234._8_4_ + auVar68._8_4_ * auVar68._8_4_;
                    auVar231._12_4_ = auVar234._12_4_ + auVar68._12_4_ * auVar68._12_4_;
                    auVar231._16_4_ = auVar234._16_4_ + auVar68._16_4_ * auVar68._16_4_;
                    auVar231._20_4_ = auVar234._20_4_ + auVar68._20_4_ * auVar68._20_4_;
                    auVar231._24_4_ = auVar234._24_4_ + auVar68._24_4_ * auVar68._24_4_;
                    auVar231._28_4_ = auVar234._28_4_ + auVar68._28_4_;
                    auVar234 = ZEXT3264(auVar231);
                    pauVar19 = pauVar19 + 1;
                    iVar21 = iVar21 + 8;
                    uVar25 = uVar33;
                  } while (iVar21 <= (int)uVar29);
                }
                uVar31 = uVar25 | 4;
                auVar239 = ZEXT816(0) << 0x40;
                while( true ) {
                  fVar38 = auVar239._4_4_;
                  fVar69 = auVar239._8_4_;
                  fVar70 = auVar239._12_4_;
                  if ((int)uVar29 < (int)uVar31) break;
                  auVar149 = vsubps_avx(*(undefined1 (*) [16])*pauVar19,auVar190);
                  auVar239._0_4_ = auVar239._0_4_ + auVar149._0_4_ * auVar149._0_4_;
                  auVar239._4_4_ = fVar38 + auVar149._4_4_ * auVar149._4_4_;
                  auVar239._8_4_ = fVar69 + auVar149._8_4_ * auVar149._8_4_;
                  auVar239._12_4_ = fVar70 + auVar149._12_4_ * auVar149._12_4_;
                  pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
                  uVar31 = uVar25 + 8;
                  uVar25 = uVar25 + 4;
                }
                fVar71 = 0.0;
                if ((int)uVar25 < (int)uVar29) {
                  uVar28 = CONCAT44(0,~uVar25 + uVar29);
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = uVar28;
                  auVar171 = vpshufd_avx(auVar44,0x44);
                  auVar202 = ZEXT436(auVar171._12_4_);
                  auVar144 = auVar154._0_16_;
                  auVar149 = vshufps_avx(auVar144,auVar144,0);
                  auVar264._16_16_ = auVar149;
                  auVar264._0_16_ = auVar149;
                  auVar149 = vorps_avx(auVar171,auVar169);
                  auVar93 = vorps_avx(auVar171,auVar169);
                  uVar26 = 0;
                  auVar266 = ZEXT464(0) << 0x40;
                  do {
                    auVar154 = auVar266;
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = uVar26;
                    auVar56 = vpshufd_avx(auVar45,0x44);
                    auVar102._16_16_ = auVar56;
                    auVar102._0_16_ = auVar56;
                    auVar68 = vorps_avx(auVar102,auVar67);
                    auVar235 = vorps_avx(auVar102,auVar167._0_32_);
                    auVar56 = vorps_avx(auVar171,auVar169);
                    auVar218._0_8_ = auVar235._16_8_ ^ 0x8000000000000000;
                    auVar218._8_4_ = auVar235._24_4_;
                    auVar218._12_4_ = auVar235._28_4_ ^ 0x80000000;
                    auVar124 = vpcmpgtq_avx(auVar218,auVar56);
                    auVar252._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
                    auVar81._8_4_ = auVar235._8_4_;
                    auVar252._8_4_ = auVar81._8_4_;
                    auVar252._12_4_ = auVar235._12_4_ ^ 0x80000000;
                    auVar161 = vpcmpgtq_avx(auVar252,auVar149);
                    auVar161 = vpackssdw_avx(auVar161,auVar124);
                    auVar157._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
                    auVar157._8_4_ = auVar68._24_4_;
                    auVar157._12_4_ = auVar68._28_4_ ^ 0x80000000;
                    auVar148 = vpcmpgtq_avx(auVar157,auVar56);
                    auVar158._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
                    auVar46._8_4_ = auVar68._8_4_;
                    auVar158._8_4_ = auVar46._8_4_;
                    auVar158._12_4_ = auVar68._12_4_ ^ 0x80000000;
                    auVar56 = vpcmpgtq_avx(auVar158,auVar93);
                    auVar56 = vpackssdw_avx(auVar56,auVar148);
                    auVar56 = vpackssdw_avx(auVar56 ^ auVar123,auVar161 ^ auVar123);
                    auVar161 = vpmovsxwd_avx(auVar56);
                    auVar56 = vpunpckhwd_avx(auVar56,auVar56);
                    auVar165._16_16_ = auVar56;
                    auVar165._0_16_ = auVar161;
                    auVar153 = vmaskmovps_avx(auVar165,*(undefined1 (*) [32])
                                                        (*pauVar19 + uVar26 * 4));
                    auVar153 = vsubps_avx(auVar153,auVar264);
                    auVar253._0_4_ = auVar153._0_4_ * auVar153._0_4_ + auVar154._0_4_;
                    auVar253._4_4_ = auVar153._4_4_ * auVar153._4_4_ + auVar154._4_4_;
                    auVar253._8_4_ = auVar153._8_4_ * auVar153._8_4_ + auVar154._8_4_;
                    auVar253._12_4_ = auVar153._12_4_ * auVar153._12_4_ + auVar154._12_4_;
                    auVar261._16_4_ = auVar153._16_4_ * auVar153._16_4_ + auVar154._16_4_;
                    auVar261._0_16_ = auVar253;
                    auVar261._20_4_ = auVar153._20_4_ * auVar153._20_4_ + auVar154._20_4_;
                    auVar261._24_4_ = auVar153._24_4_ * auVar153._24_4_ + auVar154._24_4_;
                    auVar261._28_4_ = auVar153._28_4_ + auVar154._28_4_;
                    auVar167 = ZEXT3264(_DAT_00557be0);
                    uVar26 = uVar26 + 8;
                    auVar266 = ZEXT3264(auVar261);
                  } while ((uVar28 + 8 & 0x1fffffff8) != uVar26);
                  auVar149 = vorps_avx(auVar171,auVar169);
                  auVar81._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
                  auVar81._12_4_ = auVar235._12_4_ ^ 0x80000000;
                  auVar149 = vpcmpgtq_avx(auVar81,auVar149);
                  auVar93 = vpackssdw_avx(auVar149,auVar124);
                  auVar149 = vorps_avx(auVar171,auVar169);
                  auVar46._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
                  auVar46._12_4_ = auVar68._12_4_ ^ 0x80000000;
                  auVar149 = vpcmpgtq_avx(auVar46,auVar149);
                  auVar149 = vpackssdw_avx(auVar149,auVar148);
                  auVar149 = vblendvps_avx(auVar154._0_16_,auVar253,auVar149 ^ auVar123);
                  in_ZMM2 = ZEXT1664(auVar261._16_16_);
                  auVar93 = vblendvps_avx(auVar154._16_16_,auVar261._16_16_,auVar93 ^ auVar123);
                  auVar149 = vhaddps_avx(auVar93,auVar149);
                  auVar149 = vhaddps_avx(auVar149,auVar149);
                  auVar149 = vhaddps_avx(auVar149,auVar149);
                  fVar71 = auVar149._0_4_;
                  auVar266 = ZEXT3264(auVar67);
                  auVar181 = ZEXT3264(auVar181._0_32_);
                  auVar154 = ZEXT1664(auVar144);
                }
                auVar149 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var2[-3]));
                auVar103 = auVar181._0_32_;
                if (bVar15) {
                  auVar198._0_4_ = auVar231._0_4_ * local_d8;
                  auVar198._4_4_ = auVar231._4_4_ * fStack_d4;
                  auVar198._8_4_ = auVar231._8_4_ * fStack_d0;
                  auVar198._12_4_ = auVar231._12_4_ * fStack_cc;
                  auVar198._16_4_ = auVar231._16_4_ * local_d8;
                  auVar198._20_4_ = auVar231._20_4_ * fStack_d4;
                  auVar198._24_4_ = auVar231._24_4_ * fStack_d0;
                  auVar198._28_36_ = auVar202;
                  auVar67 = auVar198._0_32_;
                }
                else {
                  auVar67 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                if (bVar16) {
                  auVar239._0_4_ = auVar239._0_4_ + auVar231._0_4_ + auVar231._16_4_;
                  auVar239._4_4_ = fVar38 + auVar231._4_4_ + auVar231._20_4_;
                  auVar239._8_4_ = fVar69 + auVar231._8_4_ + auVar231._24_4_;
                  auVar239._12_4_ = fVar70 + auVar231._12_4_ + auVar231._28_4_;
                  auVar67 = vblendps_avx(auVar67,ZEXT1632(CONCAT412(auVar239._12_4_ * fStack_cc,
                                                                    CONCAT48(auVar239._8_4_ *
                                                                             fStack_d0,
                                                                             CONCAT44(auVar239._4_4_
                                                                                      * fStack_d4,
                                                                                      auVar239._0_4_
                                                                                      * local_d8))))
                                         ,0xf);
                }
                if (bVar17) {
                  auVar93 = vshufpd_avx(auVar239,auVar239,1);
                  auVar82._0_4_ = auVar239._0_4_ + auVar93._0_4_;
                  auVar82._4_4_ = auVar239._4_4_ + auVar93._4_4_;
                  auVar82._8_4_ = auVar239._8_4_ + auVar93._8_4_;
                  auVar82._12_4_ = auVar239._12_4_ + auVar93._12_4_;
                  auVar93 = vhaddps_avx(auVar231._16_16_,auVar231._0_16_);
                  auVar171 = vmovshdup_avx(auVar82);
                  in_ZMM2 = ZEXT1664(auVar171);
                  auVar93 = vhaddps_avx(auVar93,auVar93);
                  auVar93 = vhaddps_avx(auVar93,auVar93);
                  auVar67 = vblendps_avx(auVar67,ZEXT432((uint)((fVar71 + auVar93._0_4_ +
                                                                 auVar82._0_4_ + auVar171._0_4_) *
                                                               fVar36)),1);
                }
                fVar38 = auVar67._0_4_;
                auVar194 = auVar67._0_28_;
                if (iVar22 == 1) {
                  fVar38 = fVar38 + *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
                  auVar149 = vrsqrtss_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
                  fVar69 = auVar149._0_4_;
                  fVar38 = fVar69 * -0.5 * (fVar38 * fVar69 * fVar69 + -3.0);
                  auVar67 = vblendps_avx(auVar67,ZEXT432((uint)fVar38),1);
                  auVar194 = auVar67._0_28_;
                  auVar103 = vblendps_avx(auVar103,ZEXT432((uint)(fVar38 * -auVar154._0_4_)),1);
                }
                else if (iVar22 == 4) {
                  auVar149 = vshufps_avx(auVar149,auVar149,0);
                  auVar47._0_4_ = fVar38 + auVar149._0_4_;
                  auVar47._4_4_ = auVar67._4_4_ + auVar149._4_4_;
                  auVar47._8_4_ = auVar67._8_4_ + auVar149._8_4_;
                  auVar47._12_4_ = auVar67._12_4_ + auVar149._12_4_;
                  auVar149 = vrsqrtps_avx(auVar47);
                  fVar38 = auVar149._0_4_;
                  fVar69 = auVar149._4_4_;
                  fVar70 = auVar149._8_4_;
                  fVar71 = auVar149._12_4_;
                  in_ZMM2 = ZEXT1664(CONCAT412(0xbf000000,CONCAT48(0xbf000000,0xbf000000bf000000)));
                  fVar38 = fVar38 * -0.5 * (auVar47._0_4_ * fVar38 * fVar38 + -3.0);
                  fVar69 = fVar69 * -0.5 * (auVar47._4_4_ * fVar69 * fVar69 + -3.0);
                  fVar70 = fVar70 * -0.5 * (auVar47._8_4_ * fVar70 * fVar70 + -3.0);
                  fVar71 = fVar71 * -0.5 * (auVar47._12_4_ * fVar71 * fVar71 + -3.0);
                  auVar67 = vblendps_avx(auVar67,ZEXT1632(CONCAT412(fVar71,CONCAT48(fVar70,CONCAT44(
                                                  fVar69,fVar38)))),0xf);
                  auVar194 = auVar67._0_28_;
                  auVar103 = vblendps_avx(auVar103,ZEXT1632(CONCAT412(fVar71 * -auVar181._12_4_,
                                                                      CONCAT48(fVar70 * -auVar181.
                                                  _8_4_,CONCAT44(fVar69 * -auVar181._4_4_,
                                                                 fVar38 * -auVar181._0_4_)))),0xf);
                }
                else if (iVar22 == 8) {
                  auVar149 = vshufps_avx(auVar149,auVar149,0);
                  auVar61._0_4_ = fVar38 + auVar149._0_4_;
                  auVar61._4_4_ = auVar67._4_4_ + auVar149._4_4_;
                  auVar61._8_4_ = auVar67._8_4_ + auVar149._8_4_;
                  auVar61._12_4_ = auVar67._12_4_ + auVar149._12_4_;
                  auVar61._16_4_ = auVar67._16_4_ + auVar149._0_4_;
                  auVar61._20_4_ = auVar67._20_4_ + auVar149._4_4_;
                  auVar61._24_4_ = auVar67._24_4_ + auVar149._8_4_;
                  auVar61._28_4_ = auVar67._28_4_ + auVar149._12_4_;
                  auVar67 = vrsqrtps_avx(auVar61);
                  fVar38 = auVar67._0_4_;
                  fVar69 = auVar67._4_4_;
                  fVar70 = auVar67._8_4_;
                  fVar71 = auVar67._12_4_;
                  fVar37 = auVar67._16_4_;
                  fVar199 = auVar67._20_4_;
                  fVar200 = auVar67._24_4_;
                  in_ZMM2 = ZEXT3264(CONCAT428(0xbf000000,
                                               CONCAT424(0xbf000000,
                                                         CONCAT420(0xbf000000,
                                                                   CONCAT416(0xbf000000,
                                                                             CONCAT412(0xbf000000,
                                                                                       CONCAT48(
                                                  0xbf000000,0xbf000000bf000000)))))));
                  auVar194._0_4_ = fVar38 * -0.5 * (auVar61._0_4_ * fVar38 * fVar38 + -3.0);
                  auVar194._4_4_ = fVar69 * -0.5 * (auVar61._4_4_ * fVar69 * fVar69 + -3.0);
                  auVar194._8_4_ = fVar70 * -0.5 * (auVar61._8_4_ * fVar70 * fVar70 + -3.0);
                  auVar194._12_4_ = fVar71 * -0.5 * (auVar61._12_4_ * fVar71 * fVar71 + -3.0);
                  auVar194._16_4_ = fVar37 * -0.5 * (auVar61._16_4_ * fVar37 * fVar37 + -3.0);
                  auVar194._20_4_ = fVar199 * -0.5 * (auVar61._20_4_ * fVar199 * fVar199 + -3.0);
                  auVar194._24_4_ = fVar200 * -0.5 * (auVar61._24_4_ * fVar200 * fVar200 + -3.0);
                  auVar185._0_4_ = auVar194._0_4_ * -auVar181._0_4_;
                  auVar185._4_4_ = auVar194._4_4_ * -auVar181._4_4_;
                  auVar185._8_4_ = auVar194._8_4_ * -auVar181._8_4_;
                  auVar185._12_4_ = auVar194._12_4_ * -auVar181._12_4_;
                  auVar185._16_4_ = auVar194._16_4_ * -auVar181._16_4_;
                  auVar185._20_4_ = auVar194._20_4_ * -auVar181._20_4_;
                  auVar185._28_36_ = auVar181._28_36_;
                  auVar185._24_4_ = auVar194._24_4_ * -auVar181._24_4_;
                  auVar103 = auVar185._0_32_;
                }
                auVar93 = auVar194._0_16_;
                auVar149 = auVar103._0_16_;
                if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
                  auVar171 = auVar93;
                  auVar144 = auVar149;
                  if (!bVar16) {
                    auVar171 = vshufps_avx(auVar93,auVar93,0);
                    auVar144 = vshufps_avx(auVar149,auVar149,0);
                  }
                  if (!bVar15) {
                    auVar63._16_16_ = auVar171;
                    auVar63._0_16_ = auVar171;
                    auVar194 = auVar63._0_28_;
                    auVar103._16_16_ = auVar144;
                    auVar103._0_16_ = auVar144;
                  }
                  uVar25 = 0;
                  if (7 < (int)uVar29) {
                    iVar21 = 8;
                    do {
                      auVar132._0_4_ = auVar194._0_4_ * *(float *)*pauVar35 + auVar103._0_4_;
                      auVar132._4_4_ = auVar194._4_4_ * *(float *)(*pauVar35 + 4) + auVar103._4_4_;
                      auVar132._8_4_ = auVar194._8_4_ * *(float *)(*pauVar35 + 8) + auVar103._8_4_;
                      auVar132._12_4_ =
                           auVar194._12_4_ * *(float *)(*pauVar35 + 0xc) + auVar103._12_4_;
                      auVar132._16_4_ =
                           auVar194._16_4_ * *(float *)(*pauVar35 + 0x10) + auVar103._16_4_;
                      auVar132._20_4_ =
                           auVar194._20_4_ * *(float *)(*pauVar35 + 0x14) + auVar103._20_4_;
                      auVar132._24_4_ =
                           auVar194._24_4_ * *(float *)(*pauVar35 + 0x18) + auVar103._24_4_;
                      auVar132._28_4_ = in_ZMM2._28_4_ + auVar103._28_4_;
                      in_ZMM2 = ZEXT3264(auVar132);
                      *pauVar35 = auVar132;
                      pauVar35 = pauVar35 + 1;
                      iVar21 = iVar21 + 8;
                      uVar25 = uVar33;
                    } while (iVar21 <= (int)uVar29);
                  }
                  uVar31 = uVar25 | 4;
                  while ((int)uVar31 <= (int)uVar29) {
                    auVar50._0_4_ = auVar144._0_4_ + auVar171._0_4_ * *(float *)*pauVar35;
                    auVar50._4_4_ = auVar144._4_4_ + auVar171._4_4_ * *(float *)(*pauVar35 + 4);
                    auVar50._8_4_ = auVar144._8_4_ + auVar171._8_4_ * *(float *)(*pauVar35 + 8);
                    auVar50._12_4_ = auVar144._12_4_ + auVar171._12_4_ * *(float *)(*pauVar35 + 0xc)
                    ;
                    *(undefined1 (*) [16])*pauVar35 = auVar50;
                    pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
                    uVar31 = uVar25 + 8;
                    uVar25 = uVar25 + 4;
                  }
                  if ((int)uVar25 < (int)uVar29) {
                    uVar28 = CONCAT44(0,~uVar25 + uVar29);
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = uVar28;
                    auVar171 = vpshufd_avx(auVar51,0x44);
                    auVar144 = vshufps_avx(auVar93,auVar93,0);
                    auVar56 = vshufps_avx(auVar149,auVar149,0);
                    auVar149 = vorps_avx(auVar171,auVar169);
                    auVar93 = vorps_avx(auVar171,auVar169);
                    in_ZMM2 = ZEXT1664(auVar93);
                    uVar26 = 0;
                    do {
                      auVar83._8_8_ = 0;
                      auVar83._0_8_ = uVar26;
                      auVar161 = vpshufd_avx(auVar83,0x44);
                      auVar104._16_16_ = auVar161;
                      auVar104._0_16_ = auVar161;
                      auVar67 = vorps_avx(auVar266._0_32_,auVar104);
                      auVar68 = vorps_avx(auVar104,auVar167._0_32_);
                      auVar161 = vorps_avx(auVar171,auVar169);
                      auVar205._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
                      auVar205._8_4_ = auVar68._24_4_;
                      auVar205._12_4_ = auVar68._28_4_ ^ 0x80000000;
                      auVar124 = vpcmpgtq_avx(auVar205,auVar161);
                      auVar84._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
                      auVar84._8_4_ = auVar68._8_4_;
                      auVar84._12_4_ = auVar68._12_4_ ^ 0x80000000;
                      auVar148 = vpcmpgtq_avx(auVar84,auVar149);
                      auVar124 = vpackssdw_avx(auVar148,auVar124);
                      auVar206._0_8_ = auVar67._16_8_ ^ 0x8000000000000000;
                      auVar206._8_4_ = auVar67._24_4_;
                      auVar206._12_4_ = auVar67._28_4_ ^ 0x80000000;
                      auVar161 = vpcmpgtq_avx(auVar206,auVar161);
                      auVar146._0_8_ = auVar67._0_8_ ^ 0x8000000000000000;
                      auVar146._8_4_ = auVar67._8_4_;
                      auVar146._12_4_ = auVar67._12_4_ ^ 0x80000000;
                      auVar148 = vpcmpgtq_avx(auVar146,auVar93);
                      auVar161 = vpackssdw_avx(auVar148,auVar161);
                      auVar167 = ZEXT3264(_DAT_00557be0);
                      auVar161 = vpackssdw_avx(auVar161 ^ auVar123,auVar124 ^ auVar123);
                      auVar124 = vpmovsxwd_avx(auVar161);
                      auVar161 = vpunpckhwd_avx(auVar161,auVar161);
                      auVar105._16_16_ = auVar161;
                      auVar105._0_16_ = auVar124;
                      auVar67 = vmaskmovps_avx(auVar105,*(undefined1 (*) [32])
                                                         (*pauVar35 + uVar26 * 4));
                      auVar151._0_4_ = auVar144._0_4_ * auVar67._0_4_ + auVar56._0_4_;
                      auVar151._4_4_ = auVar144._4_4_ * auVar67._4_4_ + auVar56._4_4_;
                      auVar151._8_4_ = auVar144._8_4_ * auVar67._8_4_ + auVar56._8_4_;
                      auVar151._12_4_ = auVar144._12_4_ * auVar67._12_4_ + auVar56._12_4_;
                      auVar151._16_4_ = auVar144._0_4_ * auVar67._16_4_ + auVar56._0_4_;
                      auVar151._20_4_ = auVar144._4_4_ * auVar67._20_4_ + auVar56._4_4_;
                      auVar151._24_4_ = auVar144._8_4_ * auVar67._24_4_ + auVar56._8_4_;
                      auVar151._28_4_ = auVar67._28_4_ + auVar56._12_4_;
                      auVar67 = vmaskmovps_avx(auVar105,auVar151);
                      *(undefined1 (*) [32])(*pauVar35 + uVar26 * 4) = auVar67;
                      uVar26 = uVar26 + 8;
                    } while ((uVar28 + 8 & 0x1fffffff8) != uVar26);
                  }
                }
                else {
                  fVar37 = auVar194._0_4_;
                  fVar199 = auVar194._4_4_;
                  fVar200 = auVar194._8_4_;
                  fVar201 = auVar194._12_4_;
                  fVar71 = auVar103._0_4_;
                  fVar38 = auVar103._4_4_;
                  fVar69 = auVar103._8_4_;
                  fVar70 = auVar103._12_4_;
                  pfVar20 = pfVar32;
                  pfVar27 = pfVar24;
                  if ((bool)(bVar15 & 7 < (int)uVar29)) {
                    iVar21 = 8;
                    do {
                      fVar112 = *pfVar20;
                      fVar113 = *pfVar27;
                      fVar114 = fVar37 * *(float *)*pauVar35 + fVar71;
                      fVar138 = fVar199 * *(float *)(*pauVar35 + 4) + fVar38;
                      fVar139 = fVar200 * *(float *)(*pauVar35 + 8) + fVar69;
                      fVar140 = fVar201 * *(float *)(*pauVar35 + 0xc) + fVar70;
                      fVar141 = auVar194._16_4_ * *(float *)(*pauVar35 + 0x10) + auVar103._16_4_;
                      fVar142 = auVar194._20_4_ * *(float *)(*pauVar35 + 0x14) + auVar103._20_4_;
                      fVar143 = auVar194._24_4_ * *(float *)(*pauVar35 + 0x18) + auVar103._24_4_;
                      in_ZMM2 = ZEXT3264(CONCAT428(in_ZMM2._28_4_ + auVar103._28_4_,
                                                   CONCAT424(fVar143,CONCAT420(fVar142,CONCAT416(
                                                  fVar141,CONCAT412(fVar140,CONCAT48(fVar139,
                                                  CONCAT44(fVar138,fVar114))))))));
                      auVar62._0_4_ = fVar112 * fVar114 + fVar113;
                      auVar62._4_4_ = fVar112 * fVar138 + fVar113;
                      auVar62._8_4_ = fVar112 * fVar139 + fVar113;
                      auVar62._12_4_ = fVar112 * fVar140 + fVar113;
                      auVar62._16_4_ = fVar112 * fVar141 + fVar113;
                      auVar62._20_4_ = fVar112 * fVar142 + fVar113;
                      auVar62._24_4_ = fVar112 * fVar143 + fVar113;
                      auVar62._28_4_ = fVar112 + fVar113;
                      *pauVar35 = auVar62;
                      pauVar35 = pauVar35 + 1;
                      pfVar20 = pfVar20 + 1;
                      pfVar27 = pfVar27 + 1;
                      iVar21 = iVar21 + 8;
                    } while (iVar21 <= (int)uVar29);
                  }
                  if (bVar16) {
                    iVar21 = 4;
                    if (7 < (int)uVar29) {
                      iVar21 = 8;
                      do {
                        fVar112 = *pfVar20;
                        fVar113 = pfVar20[1];
                        fVar114 = *pfVar27;
                        fVar138 = pfVar27[1];
                        auVar130._0_4_ = fVar114 + fVar112 * (fVar37 * *(float *)*pauVar35 + fVar71)
                        ;
                        auVar130._4_4_ =
                             fVar114 + fVar112 * (fVar199 * *(float *)(*pauVar35 + 4) + fVar38);
                        auVar130._8_4_ =
                             fVar114 + fVar112 * (fVar200 * *(float *)(*pauVar35 + 8) + fVar69);
                        auVar130._12_4_ =
                             fVar114 + fVar112 * (fVar201 * *(float *)(*pauVar35 + 0xc) + fVar70);
                        auVar130._16_4_ =
                             fVar138 + fVar113 * (fVar37 * *(float *)(*pauVar35 + 0x10) + fVar71);
                        auVar130._20_4_ =
                             fVar138 + fVar113 * (fVar199 * *(float *)(*pauVar35 + 0x14) + fVar38);
                        auVar130._24_4_ =
                             fVar138 + fVar113 * (fVar200 * *(float *)(*pauVar35 + 0x18) + fVar69);
                        auVar130._28_4_ = fVar138 + fVar113;
                        in_ZMM2 = ZEXT3264(auVar130);
                        *pauVar35 = auVar130;
                        pauVar35 = pauVar35 + 1;
                        pfVar20 = pfVar20 + 2;
                        pfVar27 = pfVar27 + 2;
                        iVar21 = iVar21 + 8;
                      } while (iVar21 <= (int)uVar29);
                      auVar167 = ZEXT3264(_DAT_00557be0);
                      iVar21 = uVar33 + 4;
                    }
                    for (; iVar21 <= (int)uVar29; iVar21 = iVar21 + 4) {
                      fVar112 = *pfVar20;
                      fVar113 = *pfVar27;
                      fVar114 = fVar37 * *(float *)*pauVar35 + fVar71;
                      fVar138 = fVar199 * *(float *)(*pauVar35 + 4) + fVar38;
                      fVar139 = fVar200 * *(float *)(*pauVar35 + 8) + fVar69;
                      fVar140 = fVar201 * *(float *)(*pauVar35 + 0xc) + fVar70;
                      in_ZMM2 = ZEXT1664(CONCAT412(fVar140,CONCAT48(fVar139,CONCAT44(fVar138,fVar114
                                                                                    ))));
                      auVar48._0_4_ = fVar112 * fVar114 + fVar113;
                      auVar48._4_4_ = fVar112 * fVar138 + fVar113;
                      auVar48._8_4_ = fVar112 * fVar139 + fVar113;
                      auVar48._12_4_ = fVar112 * fVar140 + fVar113;
                      *(undefined1 (*) [16])*pauVar35 = auVar48;
                      pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
                      pfVar20 = pfVar20 + 1;
                      pfVar27 = pfVar27 + 1;
                    }
                  }
                  if (bVar17) {
                    auVar93 = vshufps_avx(auVar93,auVar93,0);
                    auVar149 = vshufps_avx(auVar149,auVar149,0);
                    fVar38 = auVar93._0_4_;
                    fVar69 = auVar93._4_4_;
                    fVar70 = auVar93._8_4_;
                    fVar199 = auVar149._0_4_;
                    fVar200 = auVar149._4_4_;
                    fVar201 = auVar149._8_4_;
                    fVar112 = auVar149._12_4_;
                    uVar25 = 0;
                    if (7 < (int)uVar29) {
                      iVar21 = 8;
                      do {
                        auVar131._0_4_ =
                             (fVar38 * *(float *)*pauVar35 + fVar199) * *pfVar20 + *pfVar27;
                        auVar131._4_4_ =
                             (fVar69 * *(float *)(*pauVar35 + 4) + fVar200) * pfVar20[1] +
                             pfVar27[1];
                        auVar131._8_4_ =
                             (fVar70 * *(float *)(*pauVar35 + 8) + fVar201) * pfVar20[2] +
                             pfVar27[2];
                        auVar131._12_4_ =
                             (auVar93._12_4_ * *(float *)(*pauVar35 + 0xc) + fVar112) * pfVar20[3] +
                             pfVar27[3];
                        auVar131._16_4_ =
                             (fVar38 * *(float *)(*pauVar35 + 0x10) + fVar199) * pfVar20[4] +
                             pfVar27[4];
                        auVar131._20_4_ =
                             (fVar69 * *(float *)(*pauVar35 + 0x14) + fVar200) * pfVar20[5] +
                             pfVar27[5];
                        auVar131._24_4_ =
                             (fVar70 * *(float *)(*pauVar35 + 0x18) + fVar201) * pfVar20[6] +
                             pfVar27[6];
                        auVar131._28_4_ = in_ZMM2._28_4_ + fVar112 + pfVar27[7];
                        in_ZMM2 = ZEXT3264(auVar131);
                        *pauVar35 = auVar131;
                        pauVar35 = pauVar35 + 1;
                        pfVar20 = pfVar20 + 8;
                        pfVar27 = pfVar27 + 8;
                        iVar21 = iVar21 + 8;
                        uVar25 = uVar33;
                      } while (iVar21 <= (int)uVar29);
                    }
                    uVar31 = uVar25 | 4;
                    while ((int)uVar31 <= (int)uVar29) {
                      auVar49._0_4_ = (fVar199 + fVar38 * *(float *)*pauVar35) * *pfVar20 + *pfVar27
                      ;
                      auVar49._4_4_ =
                           (fVar200 + fVar69 * *(float *)(*pauVar35 + 4)) * pfVar20[1] + pfVar27[1];
                      auVar49._8_4_ =
                           (fVar201 + fVar70 * *(float *)(*pauVar35 + 8)) * pfVar20[2] + pfVar27[2];
                      auVar49._12_4_ =
                           (fVar112 + auVar93._12_4_ * *(float *)(*pauVar35 + 0xc)) * pfVar20[3] +
                           pfVar27[3];
                      *(undefined1 (*) [16])*pauVar35 = auVar49;
                      pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
                      pfVar20 = pfVar20 + 4;
                      pfVar27 = pfVar27 + 4;
                      uVar31 = uVar25 + 8;
                      uVar25 = uVar25 + 4;
                    }
                    if (uVar29 - uVar25 != 0 && (int)uVar25 <= (int)uVar29) {
                      lVar18 = 0;
                      do {
                        *(float *)(*pauVar35 + lVar18 * 4) =
                             (fVar37 * *(float *)(*pauVar35 + lVar18 * 4) + fVar71) *
                             pfVar20[lVar18] + pfVar27[lVar18];
                        lVar18 = lVar18 + 1;
                      } while (uVar29 - uVar25 != (int)lVar18);
                    }
                  }
                }
                uVar34 = uVar34 + 1;
              } while (uVar34 != uVar30);
            }
            local_f8 = local_f8 + 1;
          } while (local_f8 != uVar23);
        }
      }
      else if (0 < (int)uVar23) {
        uVar29 = uVar30 * iVar1 * iVar22;
        fVar36 = 1.0 / (float)(int)(uVar30 * iVar1);
        auVar92 = vshufps_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),0);
        uVar30 = uVar29 & 0xfffffff8;
        uVar34 = 0;
        auVar266 = ZEXT3264(_DAT_00557bc0);
        auVar167 = ZEXT3264(_DAT_00557be0);
        auVar170._8_8_ = 0x8000000000000000;
        auVar170._0_8_ = 0x8000000000000000;
        auVar123 = vpcmpeqd_avx(auVar123,auVar123);
        do {
          pauVar35 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar34 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar181 = ZEXT1664(ZEXT816(0) << 0x40);
          pauVar19 = pauVar35;
          uVar33 = 0;
          if (7 < (int)uVar29) {
            iVar21 = 8;
            do {
              auVar181 = ZEXT3264(CONCAT428(auVar181._28_4_ + *(float *)(*pauVar19 + 0x1c),
                                            CONCAT424(auVar181._24_4_ + *(float *)(*pauVar19 + 0x18)
                                                      ,CONCAT420(auVar181._20_4_ +
                                                                 *(float *)(*pauVar19 + 0x14),
                                                                 CONCAT416(auVar181._16_4_ +
                                                                           *(float *)(*pauVar19 +
                                                                                     0x10),
                                                                           CONCAT412(auVar181._12_4_
                                                                                     + *(float *)(*
                                                  pauVar19 + 0xc),
                                                  CONCAT48(auVar181._8_4_ +
                                                           *(float *)(*pauVar19 + 8),
                                                           CONCAT44(auVar181._4_4_ +
                                                                    *(float *)(*pauVar19 + 4),
                                                                    auVar181._0_4_ +
                                                                    *(float *)*pauVar19))))))));
              pauVar19 = pauVar19 + 1;
              iVar21 = iVar21 + 8;
              uVar33 = uVar30;
            } while (iVar21 <= (int)uVar29);
          }
          uVar25 = uVar33 | 4;
          auVar191 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar38 = auVar191._0_4_;
            fVar69 = auVar191._4_4_;
            fVar70 = auVar191._8_4_;
            fVar71 = auVar191._12_4_;
            if ((int)uVar29 < (int)uVar25) break;
            auVar191._0_4_ = fVar38 + *(float *)*pauVar19;
            auVar191._4_4_ = fVar69 + *(float *)(*pauVar19 + 4);
            auVar191._8_4_ = fVar70 + *(float *)(*pauVar19 + 8);
            auVar191._12_4_ = fVar71 + *(float *)(*pauVar19 + 0xc);
            pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
            uVar25 = uVar33 + 8;
            uVar33 = uVar33 + 4;
          }
          auVar149 = ZEXT816(0) << 0x20;
          fVar37 = 0.0;
          auVar67 = auVar266._0_32_;
          if ((int)uVar33 < (int)uVar29) {
            uVar28 = CONCAT44(0,~uVar33 + uVar29);
            auVar52._8_8_ = 0;
            auVar52._0_8_ = uVar28;
            auVar171 = vpshufd_avx(auVar52,0x44);
            auVar149 = vorps_avx(auVar171,auVar170);
            auVar93 = vorps_avx(auVar171,auVar170);
            uVar26 = 0;
            auVar154 = ZEXT1664(ZEXT816(0) << 0x40);
            do {
              auVar234 = auVar154;
              auVar85._8_8_ = 0;
              auVar85._0_8_ = uVar26;
              auVar144 = vpshufd_avx(auVar85,0x44);
              auVar106._16_16_ = auVar144;
              auVar106._0_16_ = auVar144;
              auVar68 = vorps_avx(auVar67,auVar106);
              auVar235 = vorps_avx(auVar106,auVar167._0_32_);
              auVar144 = vorps_avx(auVar171,auVar170);
              auVar219._8_4_ = auVar235._24_4_;
              auVar219._0_8_ = auVar235._16_8_ ^ 0x8000000000000000;
              auVar219._12_4_ = auVar235._28_4_ ^ 0x80000000;
              auVar161 = vpcmpgtq_avx(auVar219,auVar144);
              auVar86._8_4_ = auVar235._8_4_;
              auVar240._8_4_ = auVar86._8_4_;
              auVar240._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
              auVar240._12_4_ = auVar235._12_4_ ^ 0x80000000;
              auVar56 = vpcmpgtq_avx(auVar240,auVar149);
              auVar56 = vpackssdw_avx(auVar56,auVar161);
              auVar254._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
              auVar254._8_4_ = auVar68._24_4_;
              auVar254._12_4_ = auVar68._28_4_ ^ 0x80000000;
              auVar124 = vpcmpgtq_avx(auVar254,auVar144);
              auVar255._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
              auVar255._8_4_ = auVar68._8_4_;
              auVar255._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar144 = vpcmpgtq_avx(auVar255,auVar93);
              auVar144 = vpackssdw_avx(auVar144,auVar124);
              auVar144 = vpackssdw_avx(auVar144 ^ auVar123,auVar56 ^ auVar123);
              auVar56 = vpmovsxwd_avx(auVar144);
              auVar144 = vpunpckhwd_avx(auVar144,auVar144);
              auVar245._16_16_ = auVar144;
              auVar245._0_16_ = auVar56;
              auVar153 = vmaskmovps_avx(auVar245,*(undefined1 (*) [32])(*pauVar19 + uVar26 * 4));
              auVar225._0_4_ = auVar153._0_4_ + auVar234._0_4_;
              auVar225._4_4_ = auVar153._4_4_ + auVar234._4_4_;
              auVar225._8_4_ = auVar153._8_4_ + auVar234._8_4_;
              auVar225._12_4_ = auVar153._12_4_ + auVar234._12_4_;
              auVar232._16_4_ = auVar153._16_4_ + auVar234._16_4_;
              auVar232._0_16_ = auVar225;
              auVar232._20_4_ = auVar153._20_4_ + auVar234._20_4_;
              auVar232._24_4_ = auVar153._24_4_ + auVar234._24_4_;
              auVar232._28_4_ = auVar153._28_4_ + auVar234._28_4_;
              uVar26 = uVar26 + 8;
              auVar154 = ZEXT3264(auVar232);
            } while ((uVar28 + 8 & 0x1fffffff8) != uVar26);
            auVar149 = vorps_avx(auVar171,auVar170);
            auVar86._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
            auVar86._12_4_ = auVar235._12_4_ ^ 0x80000000;
            auVar149 = vpcmpgtq_avx(auVar86,auVar149);
            auVar93 = vpackssdw_avx(auVar149,auVar161);
            auVar149 = vorps_avx(auVar171,auVar170);
            auVar120._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
            auVar120._8_4_ = auVar68._8_4_;
            auVar120._12_4_ = auVar68._12_4_ ^ 0x80000000;
            auVar149 = vpcmpgtq_avx(auVar120,auVar149);
            auVar149 = vpackssdw_avx(auVar149,auVar124);
            auVar149 = vblendvps_avx(auVar234._0_16_,auVar225,auVar149 ^ auVar123);
            in_ZMM2 = ZEXT1664(auVar232._16_16_);
            auVar93 = vblendvps_avx(auVar234._16_16_,auVar232._16_16_,auVar93 ^ auVar123);
            auVar149 = vhaddps_avx(auVar93,auVar149);
            auVar149 = vhaddps_avx(auVar149,auVar149);
            auVar149 = vhaddps_avx(auVar149,auVar149);
            fVar37 = auVar149._0_4_;
            auVar149 = ZEXT816(0);
          }
          auVar154 = ZEXT1664(auVar149 << 0x20);
          local_b8 = auVar92._0_4_;
          fStack_b4 = auVar92._4_4_;
          fStack_b0 = auVar92._8_4_;
          fStack_ac = auVar92._12_4_;
          if (iVar22 == 8) {
            auVar177._0_4_ = auVar181._0_4_ * local_b8;
            auVar177._4_4_ = auVar181._4_4_ * fStack_b4;
            auVar177._8_4_ = auVar181._8_4_ * fStack_b0;
            auVar177._12_4_ = auVar181._12_4_ * fStack_ac;
            auVar154._16_4_ = auVar181._16_4_ * local_b8;
            auVar154._0_16_ = auVar177;
            auVar154._20_4_ = auVar181._20_4_ * fStack_b4;
            auVar154._28_36_ = auVar181._28_36_;
            auVar154._24_4_ = auVar181._24_4_ * fStack_b0;
            auVar64 = auVar154._0_32_;
            auVar181 = ZEXT3264(auVar64);
            auVar192 = vshufps_avx(auVar177,auVar177,0);
            bVar15 = true;
            bVar17 = false;
            auVar154 = ZEXT1664(auVar177);
            bVar16 = false;
          }
          else {
            if (iVar22 == 4) {
              auVar192._0_4_ = (fVar38 + auVar181._16_4_ + auVar181._0_4_) * local_b8;
              auVar192._4_4_ = (fVar69 + auVar181._20_4_ + auVar181._4_4_) * fStack_b4;
              auVar192._8_4_ = (fVar70 + auVar181._24_4_ + auVar181._8_4_) * fStack_b0;
              auVar192._12_4_ = (fVar71 + auVar181._28_4_ + auVar181._12_4_) * fStack_ac;
              bVar16 = true;
              bVar17 = false;
              auVar154 = ZEXT1664(auVar192);
              auVar149 = auVar192;
            }
            else {
              if (iVar22 != 1) {
                auVar149 = ZEXT816(0);
                auVar192 = ZEXT816(0) << 0x40;
              }
              else {
                auVar93 = vshufpd_avx(auVar191,auVar191,1);
                auVar149 = vhaddps_avx(auVar181._16_16_,auVar181._0_16_);
                auVar121._0_4_ = fVar38 + auVar93._0_4_;
                auVar121._4_4_ = fVar69 + auVar93._4_4_;
                auVar121._8_4_ = fVar70 + auVar93._8_4_;
                auVar121._12_4_ = fVar71 + auVar93._12_4_;
                in_ZMM2 = ZEXT1664(auVar121);
                auVar149 = vhaddps_avx(auVar149,auVar149);
                auVar93 = vmovshdup_avx(auVar121);
                auVar149 = vhaddps_avx(auVar149,auVar149);
                fVar38 = (auVar149._0_4_ + auVar93._0_4_ + auVar121._0_4_ + fVar37) * fVar36;
                auVar154 = ZEXT464((uint)fVar38);
                auVar149 = vblendps_avx(ZEXT416((uint)fVar38),_DAT_005573b0,0xe);
                auVar192 = vshufps_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38),0);
              }
              bVar17 = iVar22 == 1;
              bVar16 = false;
            }
            auVar181 = ZEXT1664(auVar149);
            auVar64._16_16_ = auVar192;
            auVar64._0_16_ = auVar192;
            bVar15 = false;
          }
          auVar202 = (undefined1  [36])0x0;
          pauVar19 = pauVar35;
          if ((int)uVar29 < 8) {
            auVar233 = SUB6432(ZEXT864(0),0);
            uVar33 = 0;
          }
          else {
            auVar234 = ZEXT864(0);
            iVar21 = 8;
            do {
              auVar68 = vsubps_avx(*pauVar19,auVar64);
              auVar233._0_4_ = auVar234._0_4_ + auVar68._0_4_ * auVar68._0_4_;
              auVar233._4_4_ = auVar234._4_4_ + auVar68._4_4_ * auVar68._4_4_;
              auVar233._8_4_ = auVar234._8_4_ + auVar68._8_4_ * auVar68._8_4_;
              auVar233._12_4_ = auVar234._12_4_ + auVar68._12_4_ * auVar68._12_4_;
              auVar233._16_4_ = auVar234._16_4_ + auVar68._16_4_ * auVar68._16_4_;
              auVar233._20_4_ = auVar234._20_4_ + auVar68._20_4_ * auVar68._20_4_;
              auVar233._24_4_ = auVar234._24_4_ + auVar68._24_4_ * auVar68._24_4_;
              auVar233._28_4_ = auVar234._28_4_ + auVar68._28_4_;
              auVar234 = ZEXT3264(auVar233);
              pauVar19 = pauVar19 + 1;
              iVar21 = iVar21 + 8;
              uVar33 = uVar30;
            } while (iVar21 <= (int)uVar29);
          }
          uVar25 = uVar33 | 4;
          auVar241 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar38 = auVar241._4_4_;
            fVar69 = auVar241._8_4_;
            fVar70 = auVar241._12_4_;
            if ((int)uVar29 < (int)uVar25) break;
            auVar149 = vsubps_avx(*(undefined1 (*) [16])*pauVar19,auVar192);
            auVar241._0_4_ = auVar241._0_4_ + auVar149._0_4_ * auVar149._0_4_;
            auVar241._4_4_ = fVar38 + auVar149._4_4_ * auVar149._4_4_;
            auVar241._8_4_ = fVar69 + auVar149._8_4_ * auVar149._8_4_;
            auVar241._12_4_ = fVar70 + auVar149._12_4_ * auVar149._12_4_;
            pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
            uVar25 = uVar33 + 8;
            uVar33 = uVar33 + 4;
          }
          fVar71 = 0.0;
          if ((int)uVar33 < (int)uVar29) {
            uVar28 = CONCAT44(0,~uVar33 + uVar29);
            auVar53._8_8_ = 0;
            auVar53._0_8_ = uVar28;
            auVar171 = vpshufd_avx(auVar53,0x44);
            auVar202 = ZEXT436(auVar171._12_4_);
            auVar144 = auVar154._0_16_;
            auVar149 = vshufps_avx(auVar144,auVar144,0);
            auVar265._16_16_ = auVar149;
            auVar265._0_16_ = auVar149;
            auVar149 = vorps_avx(auVar171,auVar170);
            auVar93 = vorps_avx(auVar171,auVar170);
            uVar26 = 0;
            auVar266 = ZEXT464(0) << 0x40;
            do {
              auVar154 = auVar266;
              auVar87._8_8_ = 0;
              auVar87._0_8_ = uVar26;
              auVar56 = vpshufd_avx(auVar87,0x44);
              auVar107._16_16_ = auVar56;
              auVar107._0_16_ = auVar56;
              auVar68 = vorps_avx(auVar107,auVar67);
              auVar235 = vorps_avx(auVar107,auVar167._0_32_);
              auVar56 = vorps_avx(auVar171,auVar170);
              auVar220._0_8_ = auVar235._16_8_ ^ 0x8000000000000000;
              auVar220._8_4_ = auVar235._24_4_;
              auVar220._12_4_ = auVar235._28_4_ ^ 0x80000000;
              auVar124 = vpcmpgtq_avx(auVar220,auVar56);
              auVar256._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
              auVar88._8_4_ = auVar235._8_4_;
              auVar256._8_4_ = auVar88._8_4_;
              auVar256._12_4_ = auVar235._12_4_ ^ 0x80000000;
              auVar161 = vpcmpgtq_avx(auVar256,auVar149);
              auVar161 = vpackssdw_avx(auVar161,auVar124);
              auVar159._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
              auVar159._8_4_ = auVar68._24_4_;
              auVar159._12_4_ = auVar68._28_4_ ^ 0x80000000;
              auVar148 = vpcmpgtq_avx(auVar159,auVar56);
              auVar160._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
              auVar122._8_4_ = auVar68._8_4_;
              auVar160._8_4_ = auVar122._8_4_;
              auVar160._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar56 = vpcmpgtq_avx(auVar160,auVar93);
              auVar56 = vpackssdw_avx(auVar56,auVar148);
              auVar56 = vpackssdw_avx(auVar56 ^ auVar123,auVar161 ^ auVar123);
              auVar161 = vpmovsxwd_avx(auVar56);
              auVar56 = vpunpckhwd_avx(auVar56,auVar56);
              auVar166._16_16_ = auVar56;
              auVar166._0_16_ = auVar161;
              auVar153 = vmaskmovps_avx(auVar166,*(undefined1 (*) [32])(*pauVar19 + uVar26 * 4));
              auVar153 = vsubps_avx(auVar153,auVar265);
              auVar257._0_4_ = auVar153._0_4_ * auVar153._0_4_ + auVar154._0_4_;
              auVar257._4_4_ = auVar153._4_4_ * auVar153._4_4_ + auVar154._4_4_;
              auVar257._8_4_ = auVar153._8_4_ * auVar153._8_4_ + auVar154._8_4_;
              auVar257._12_4_ = auVar153._12_4_ * auVar153._12_4_ + auVar154._12_4_;
              auVar262._16_4_ = auVar153._16_4_ * auVar153._16_4_ + auVar154._16_4_;
              auVar262._0_16_ = auVar257;
              auVar262._20_4_ = auVar153._20_4_ * auVar153._20_4_ + auVar154._20_4_;
              auVar262._24_4_ = auVar153._24_4_ * auVar153._24_4_ + auVar154._24_4_;
              auVar262._28_4_ = auVar153._28_4_ + auVar154._28_4_;
              auVar167 = ZEXT3264(_DAT_00557be0);
              uVar26 = uVar26 + 8;
              auVar266 = ZEXT3264(auVar262);
            } while ((uVar28 + 8 & 0x1fffffff8) != uVar26);
            auVar149 = vorps_avx(auVar171,auVar170);
            auVar88._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
            auVar88._12_4_ = auVar235._12_4_ ^ 0x80000000;
            auVar149 = vpcmpgtq_avx(auVar88,auVar149);
            auVar93 = vpackssdw_avx(auVar149,auVar124);
            auVar149 = vorps_avx(auVar171,auVar170);
            auVar122._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
            auVar122._12_4_ = auVar68._12_4_ ^ 0x80000000;
            auVar149 = vpcmpgtq_avx(auVar122,auVar149);
            auVar149 = vpackssdw_avx(auVar149,auVar148);
            auVar149 = vblendvps_avx(auVar154._0_16_,auVar257,auVar149 ^ auVar123);
            in_ZMM2 = ZEXT1664(auVar262._16_16_);
            auVar93 = vblendvps_avx(auVar154._16_16_,auVar262._16_16_,auVar93 ^ auVar123);
            auVar149 = vhaddps_avx(auVar93,auVar149);
            auVar149 = vhaddps_avx(auVar149,auVar149);
            auVar149 = vhaddps_avx(auVar149,auVar149);
            fVar71 = auVar149._0_4_;
            auVar266 = ZEXT3264(auVar67);
            auVar181 = ZEXT3264(auVar181._0_32_);
            auVar154 = ZEXT1664(auVar144);
          }
          auVar149 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var2[-3]));
          auVar108 = auVar181._0_32_;
          if (bVar15) {
            auVar234._0_4_ = auVar233._0_4_ * local_b8;
            auVar234._4_4_ = auVar233._4_4_ * fStack_b4;
            auVar234._8_4_ = auVar233._8_4_ * fStack_b0;
            auVar234._12_4_ = auVar233._12_4_ * fStack_ac;
            auVar234._16_4_ = auVar233._16_4_ * local_b8;
            auVar234._20_4_ = auVar233._20_4_ * fStack_b4;
            auVar234._24_4_ = auVar233._24_4_ * fStack_b0;
            auVar234._28_36_ = auVar202;
            auVar67 = auVar234._0_32_;
          }
          else {
            auVar67 = ZEXT1632(ZEXT816(0) << 0x40);
          }
          if (bVar16) {
            auVar241._0_4_ = auVar241._0_4_ + auVar233._0_4_ + auVar233._16_4_;
            auVar241._4_4_ = fVar38 + auVar233._4_4_ + auVar233._20_4_;
            auVar241._8_4_ = fVar69 + auVar233._8_4_ + auVar233._24_4_;
            auVar241._12_4_ = fVar70 + auVar233._12_4_ + auVar233._28_4_;
            auVar67 = vblendps_avx(auVar67,ZEXT1632(CONCAT412(auVar241._12_4_ * fStack_ac,
                                                              CONCAT48(auVar241._8_4_ * fStack_b0,
                                                                       CONCAT44(auVar241._4_4_ *
                                                                                fStack_b4,
                                                                                auVar241._0_4_ *
                                                                                local_b8)))),0xf);
          }
          if (bVar17) {
            auVar93 = vshufpd_avx(auVar241,auVar241,1);
            auVar89._0_4_ = auVar241._0_4_ + auVar93._0_4_;
            auVar89._4_4_ = auVar241._4_4_ + auVar93._4_4_;
            auVar89._8_4_ = auVar241._8_4_ + auVar93._8_4_;
            auVar89._12_4_ = auVar241._12_4_ + auVar93._12_4_;
            auVar93 = vhaddps_avx(auVar233._16_16_,auVar233._0_16_);
            auVar171 = vmovshdup_avx(auVar89);
            in_ZMM2 = ZEXT1664(auVar171);
            auVar93 = vhaddps_avx(auVar93,auVar93);
            auVar93 = vhaddps_avx(auVar93,auVar93);
            auVar67 = vblendps_avx(auVar67,ZEXT432((uint)((fVar71 + auVar93._0_4_ + auVar89._0_4_ +
                                                          auVar171._0_4_) * fVar36)),1);
          }
          fVar38 = auVar67._0_4_;
          auVar195 = auVar67._0_28_;
          if (iVar22 == 1) {
            fVar38 = fVar38 + *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
            auVar149 = vrsqrtss_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
            fVar69 = auVar149._0_4_;
            fVar38 = fVar69 * -0.5 * (fVar38 * fVar69 * fVar69 + -3.0);
            auVar67 = vblendps_avx(auVar67,ZEXT432((uint)fVar38),1);
            auVar195 = auVar67._0_28_;
            auVar108 = vblendps_avx(auVar108,ZEXT432((uint)(fVar38 * -auVar154._0_4_)),1);
          }
          else if (iVar22 == 4) {
            auVar149 = vshufps_avx(auVar149,auVar149,0);
            auVar54._0_4_ = fVar38 + auVar149._0_4_;
            auVar54._4_4_ = auVar67._4_4_ + auVar149._4_4_;
            auVar54._8_4_ = auVar67._8_4_ + auVar149._8_4_;
            auVar54._12_4_ = auVar67._12_4_ + auVar149._12_4_;
            auVar149 = vrsqrtps_avx(auVar54);
            fVar38 = auVar149._0_4_;
            fVar69 = auVar149._4_4_;
            fVar70 = auVar149._8_4_;
            fVar71 = auVar149._12_4_;
            in_ZMM2 = ZEXT1664(CONCAT412(0xbf000000,CONCAT48(0xbf000000,0xbf000000bf000000)));
            fVar38 = fVar38 * -0.5 * (auVar54._0_4_ * fVar38 * fVar38 + -3.0);
            fVar69 = fVar69 * -0.5 * (auVar54._4_4_ * fVar69 * fVar69 + -3.0);
            fVar70 = fVar70 * -0.5 * (auVar54._8_4_ * fVar70 * fVar70 + -3.0);
            fVar71 = fVar71 * -0.5 * (auVar54._12_4_ * fVar71 * fVar71 + -3.0);
            auVar67 = vblendps_avx(auVar67,ZEXT1632(CONCAT412(fVar71,CONCAT48(fVar70,CONCAT44(fVar69
                                                  ,fVar38)))),0xf);
            auVar195 = auVar67._0_28_;
            auVar108 = vblendps_avx(auVar108,ZEXT1632(CONCAT412(fVar71 * -auVar181._12_4_,
                                                                CONCAT48(fVar70 * -auVar181._8_4_,
                                                                         CONCAT44(fVar69 * -auVar181
                                                  ._4_4_,fVar38 * -auVar181._0_4_)))),0xf);
          }
          else if (iVar22 == 8) {
            auVar149 = vshufps_avx(auVar149,auVar149,0);
            auVar65._0_4_ = fVar38 + auVar149._0_4_;
            auVar65._4_4_ = auVar67._4_4_ + auVar149._4_4_;
            auVar65._8_4_ = auVar67._8_4_ + auVar149._8_4_;
            auVar65._12_4_ = auVar67._12_4_ + auVar149._12_4_;
            auVar65._16_4_ = auVar67._16_4_ + auVar149._0_4_;
            auVar65._20_4_ = auVar67._20_4_ + auVar149._4_4_;
            auVar65._24_4_ = auVar67._24_4_ + auVar149._8_4_;
            auVar65._28_4_ = auVar67._28_4_ + auVar149._12_4_;
            auVar67 = vrsqrtps_avx(auVar65);
            fVar38 = auVar67._0_4_;
            fVar69 = auVar67._4_4_;
            fVar70 = auVar67._8_4_;
            fVar71 = auVar67._12_4_;
            fVar37 = auVar67._16_4_;
            fVar199 = auVar67._20_4_;
            fVar200 = auVar67._24_4_;
            in_ZMM2 = ZEXT3264(CONCAT428(0xbf000000,
                                         CONCAT424(0xbf000000,
                                                   CONCAT420(0xbf000000,
                                                             CONCAT416(0xbf000000,
                                                                       CONCAT412(0xbf000000,
                                                                                 CONCAT48(0xbf000000
                                                                                          ,
                                                  0xbf000000bf000000)))))));
            auVar195._0_4_ = fVar38 * -0.5 * (auVar65._0_4_ * fVar38 * fVar38 + -3.0);
            auVar195._4_4_ = fVar69 * -0.5 * (auVar65._4_4_ * fVar69 * fVar69 + -3.0);
            auVar195._8_4_ = fVar70 * -0.5 * (auVar65._8_4_ * fVar70 * fVar70 + -3.0);
            auVar195._12_4_ = fVar71 * -0.5 * (auVar65._12_4_ * fVar71 * fVar71 + -3.0);
            auVar195._16_4_ = fVar37 * -0.5 * (auVar65._16_4_ * fVar37 * fVar37 + -3.0);
            auVar195._20_4_ = fVar199 * -0.5 * (auVar65._20_4_ * fVar199 * fVar199 + -3.0);
            auVar195._24_4_ = fVar200 * -0.5 * (auVar65._24_4_ * fVar200 * fVar200 + -3.0);
            auVar186._0_4_ = auVar195._0_4_ * -auVar181._0_4_;
            auVar186._4_4_ = auVar195._4_4_ * -auVar181._4_4_;
            auVar186._8_4_ = auVar195._8_4_ * -auVar181._8_4_;
            auVar186._12_4_ = auVar195._12_4_ * -auVar181._12_4_;
            auVar186._16_4_ = auVar195._16_4_ * -auVar181._16_4_;
            auVar186._20_4_ = auVar195._20_4_ * -auVar181._20_4_;
            auVar186._28_36_ = auVar181._28_36_;
            auVar186._24_4_ = auVar195._24_4_ * -auVar181._24_4_;
            auVar108 = auVar186._0_32_;
          }
          auVar93 = auVar195._0_16_;
          auVar149 = auVar108._0_16_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
            auVar171 = auVar93;
            auVar144 = auVar149;
            if (!bVar16) {
              auVar171 = vshufps_avx(auVar93,auVar93,0);
              auVar144 = vshufps_avx(auVar149,auVar149,0);
            }
            if (!bVar15) {
              auVar66._16_16_ = auVar171;
              auVar66._0_16_ = auVar171;
              auVar195 = auVar66._0_28_;
              auVar108._16_16_ = auVar144;
              auVar108._0_16_ = auVar144;
            }
            uVar33 = 0;
            if (7 < (int)uVar29) {
              iVar21 = 8;
              do {
                auVar135._0_4_ = auVar195._0_4_ * *(float *)*pauVar35 + auVar108._0_4_;
                auVar135._4_4_ = auVar195._4_4_ * *(float *)(*pauVar35 + 4) + auVar108._4_4_;
                auVar135._8_4_ = auVar195._8_4_ * *(float *)(*pauVar35 + 8) + auVar108._8_4_;
                auVar135._12_4_ = auVar195._12_4_ * *(float *)(*pauVar35 + 0xc) + auVar108._12_4_;
                auVar135._16_4_ = auVar195._16_4_ * *(float *)(*pauVar35 + 0x10) + auVar108._16_4_;
                auVar135._20_4_ = auVar195._20_4_ * *(float *)(*pauVar35 + 0x14) + auVar108._20_4_;
                auVar135._24_4_ = auVar195._24_4_ * *(float *)(*pauVar35 + 0x18) + auVar108._24_4_;
                auVar135._28_4_ = in_ZMM2._28_4_ + auVar108._28_4_;
                in_ZMM2 = ZEXT3264(auVar135);
                *pauVar35 = auVar135;
                pauVar35 = pauVar35 + 1;
                iVar21 = iVar21 + 8;
                uVar33 = uVar30;
              } while (iVar21 <= (int)uVar29);
            }
            uVar25 = uVar33 | 4;
            while ((int)uVar25 <= (int)uVar29) {
              fVar38 = *(float *)(*pauVar35 + 4);
              fVar69 = *(float *)(*pauVar35 + 8);
              fVar70 = *(float *)(*pauVar35 + 0xc);
              *(float *)*pauVar35 = auVar144._0_4_ + auVar171._0_4_ * *(float *)*pauVar35;
              *(float *)(*pauVar35 + 4) = auVar144._4_4_ + auVar171._4_4_ * fVar38;
              *(float *)(*pauVar35 + 8) = auVar144._8_4_ + auVar171._8_4_ * fVar69;
              *(float *)(*pauVar35 + 0xc) = auVar144._12_4_ + auVar171._12_4_ * fVar70;
              pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
              uVar25 = uVar33 + 8;
              uVar33 = uVar33 + 4;
            }
            if ((int)uVar33 < (int)uVar29) {
              uVar28 = CONCAT44(0,~uVar33 + uVar29);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = uVar28;
              auVar171 = vpshufd_avx(auVar55,0x44);
              auVar144 = vshufps_avx(auVar93,auVar93,0);
              auVar56 = vshufps_avx(auVar149,auVar149,0);
              auVar149 = vorps_avx(auVar171,auVar170);
              auVar93 = vorps_avx(auVar171,auVar170);
              in_ZMM2 = ZEXT1664(auVar93);
              uVar26 = 0;
              do {
                auVar90._8_8_ = 0;
                auVar90._0_8_ = uVar26;
                auVar161 = vpshufd_avx(auVar90,0x44);
                auVar109._16_16_ = auVar161;
                auVar109._0_16_ = auVar161;
                auVar67 = vorps_avx(auVar266._0_32_,auVar109);
                auVar68 = vorps_avx(auVar109,auVar167._0_32_);
                auVar161 = vorps_avx(auVar171,auVar170);
                auVar207._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
                auVar207._8_4_ = auVar68._24_4_;
                auVar207._12_4_ = auVar68._28_4_ ^ 0x80000000;
                auVar124 = vpcmpgtq_avx(auVar207,auVar161);
                auVar91._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
                auVar91._8_4_ = auVar68._8_4_;
                auVar91._12_4_ = auVar68._12_4_ ^ 0x80000000;
                auVar148 = vpcmpgtq_avx(auVar91,auVar149);
                auVar124 = vpackssdw_avx(auVar148,auVar124);
                auVar208._0_8_ = auVar67._16_8_ ^ 0x8000000000000000;
                auVar208._8_4_ = auVar67._24_4_;
                auVar208._12_4_ = auVar67._28_4_ ^ 0x80000000;
                auVar161 = vpcmpgtq_avx(auVar208,auVar161);
                auVar147._0_8_ = auVar67._0_8_ ^ 0x8000000000000000;
                auVar147._8_4_ = auVar67._8_4_;
                auVar147._12_4_ = auVar67._12_4_ ^ 0x80000000;
                auVar148 = vpcmpgtq_avx(auVar147,auVar93);
                auVar161 = vpackssdw_avx(auVar148,auVar161);
                auVar167 = ZEXT3264(_DAT_00557be0);
                auVar161 = vpackssdw_avx(auVar161 ^ auVar123,auVar124 ^ auVar123);
                auVar124 = vpmovsxwd_avx(auVar161);
                auVar161 = vpunpckhwd_avx(auVar161,auVar161);
                auVar110._16_16_ = auVar161;
                auVar110._0_16_ = auVar124;
                auVar67 = vmaskmovps_avx(auVar110,*(undefined1 (*) [32])(*pauVar35 + uVar26 * 4));
                auVar152._0_4_ = auVar144._0_4_ * auVar67._0_4_ + auVar56._0_4_;
                auVar152._4_4_ = auVar144._4_4_ * auVar67._4_4_ + auVar56._4_4_;
                auVar152._8_4_ = auVar144._8_4_ * auVar67._8_4_ + auVar56._8_4_;
                auVar152._12_4_ = auVar144._12_4_ * auVar67._12_4_ + auVar56._12_4_;
                auVar152._16_4_ = auVar144._0_4_ * auVar67._16_4_ + auVar56._0_4_;
                auVar152._20_4_ = auVar144._4_4_ * auVar67._20_4_ + auVar56._4_4_;
                auVar152._24_4_ = auVar144._8_4_ * auVar67._24_4_ + auVar56._8_4_;
                auVar152._28_4_ = auVar67._28_4_ + auVar56._12_4_;
                auVar67 = vmaskmovps_avx(auVar110,auVar152);
                *(undefined1 (*) [32])(*pauVar35 + uVar26 * 4) = auVar67;
                uVar26 = uVar26 + 8;
              } while ((uVar28 + 8 & 0x1fffffff8) != uVar26);
            }
          }
          else {
            fVar37 = auVar195._0_4_;
            fVar199 = auVar195._4_4_;
            fVar200 = auVar195._8_4_;
            fVar201 = auVar195._12_4_;
            fVar71 = auVar108._0_4_;
            fVar38 = auVar108._4_4_;
            fVar69 = auVar108._8_4_;
            fVar70 = auVar108._12_4_;
            pfVar20 = pfVar24;
            pfVar27 = pfVar32;
            if (bVar15 && 7 < (int)uVar29) {
              iVar21 = 8;
              do {
                fVar112 = *pfVar27;
                fVar113 = *pfVar20;
                fVar114 = fVar37 * *(float *)*pauVar35 + fVar71;
                fVar138 = fVar199 * *(float *)(*pauVar35 + 4) + fVar38;
                fVar139 = fVar200 * *(float *)(*pauVar35 + 8) + fVar69;
                fVar140 = fVar201 * *(float *)(*pauVar35 + 0xc) + fVar70;
                fVar141 = auVar195._16_4_ * *(float *)(*pauVar35 + 0x10) + auVar108._16_4_;
                fVar142 = auVar195._20_4_ * *(float *)(*pauVar35 + 0x14) + auVar108._20_4_;
                fVar143 = auVar195._24_4_ * *(float *)(*pauVar35 + 0x18) + auVar108._24_4_;
                in_ZMM2 = ZEXT3264(CONCAT428(in_ZMM2._28_4_ + auVar108._28_4_,
                                             CONCAT424(fVar143,CONCAT420(fVar142,CONCAT416(fVar141,
                                                  CONCAT412(fVar140,CONCAT48(fVar139,CONCAT44(
                                                  fVar138,fVar114))))))));
                *(float *)*pauVar35 = fVar112 * fVar114 + fVar113;
                *(float *)(*pauVar35 + 4) = fVar112 * fVar138 + fVar113;
                *(float *)(*pauVar35 + 8) = fVar112 * fVar139 + fVar113;
                *(float *)(*pauVar35 + 0xc) = fVar112 * fVar140 + fVar113;
                *(float *)(*pauVar35 + 0x10) = fVar112 * fVar141 + fVar113;
                *(float *)(*pauVar35 + 0x14) = fVar112 * fVar142 + fVar113;
                *(float *)(*pauVar35 + 0x18) = fVar112 * fVar143 + fVar113;
                *(float *)(*pauVar35 + 0x1c) = fVar112 + fVar113;
                pauVar35 = pauVar35 + 1;
                pfVar27 = pfVar27 + 1;
                pfVar20 = pfVar20 + 1;
                iVar21 = iVar21 + 8;
              } while (iVar21 <= (int)uVar29);
            }
            if (bVar16) {
              iVar21 = 4;
              if (7 < (int)uVar29) {
                iVar21 = 8;
                do {
                  fVar112 = *pfVar27;
                  fVar113 = pfVar27[1];
                  fVar114 = *pfVar20;
                  fVar138 = pfVar20[1];
                  auVar133._0_4_ = fVar114 + fVar112 * (fVar37 * *(float *)*pauVar35 + fVar71);
                  auVar133._4_4_ =
                       fVar114 + fVar112 * (fVar199 * *(float *)(*pauVar35 + 4) + fVar38);
                  auVar133._8_4_ =
                       fVar114 + fVar112 * (fVar200 * *(float *)(*pauVar35 + 8) + fVar69);
                  auVar133._12_4_ =
                       fVar114 + fVar112 * (fVar201 * *(float *)(*pauVar35 + 0xc) + fVar70);
                  auVar133._16_4_ =
                       fVar138 + fVar113 * (fVar37 * *(float *)(*pauVar35 + 0x10) + fVar71);
                  auVar133._20_4_ =
                       fVar138 + fVar113 * (fVar199 * *(float *)(*pauVar35 + 0x14) + fVar38);
                  auVar133._24_4_ =
                       fVar138 + fVar113 * (fVar200 * *(float *)(*pauVar35 + 0x18) + fVar69);
                  auVar133._28_4_ = fVar138 + fVar113;
                  in_ZMM2 = ZEXT3264(auVar133);
                  *pauVar35 = auVar133;
                  pauVar35 = pauVar35 + 1;
                  pfVar27 = pfVar27 + 2;
                  pfVar20 = pfVar20 + 2;
                  iVar21 = iVar21 + 8;
                } while (iVar21 <= (int)uVar29);
                auVar167 = ZEXT3264(_DAT_00557be0);
                iVar21 = uVar30 + 4;
              }
              for (; iVar21 <= (int)uVar29; iVar21 = iVar21 + 4) {
                fVar112 = *pfVar27;
                fVar113 = *pfVar20;
                fVar114 = fVar37 * *(float *)*pauVar35 + fVar71;
                fVar138 = fVar199 * *(float *)(*pauVar35 + 4) + fVar38;
                fVar139 = fVar200 * *(float *)(*pauVar35 + 8) + fVar69;
                fVar140 = fVar201 * *(float *)(*pauVar35 + 0xc) + fVar70;
                in_ZMM2 = ZEXT1664(CONCAT412(fVar140,CONCAT48(fVar139,CONCAT44(fVar138,fVar114))));
                *(float *)*pauVar35 = fVar112 * fVar114 + fVar113;
                *(float *)(*pauVar35 + 4) = fVar112 * fVar138 + fVar113;
                *(float *)(*pauVar35 + 8) = fVar112 * fVar139 + fVar113;
                *(float *)(*pauVar35 + 0xc) = fVar112 * fVar140 + fVar113;
                pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
                pfVar27 = pfVar27 + 1;
                pfVar20 = pfVar20 + 1;
              }
            }
            if (bVar17) {
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              auVar149 = vshufps_avx(auVar149,auVar149,0);
              fVar199 = auVar149._0_4_;
              fVar200 = auVar149._4_4_;
              fVar201 = auVar149._8_4_;
              fVar112 = auVar149._12_4_;
              fVar38 = auVar93._0_4_;
              fVar69 = auVar93._4_4_;
              fVar70 = auVar93._8_4_;
              uVar33 = 0;
              if (7 < (int)uVar29) {
                iVar21 = 8;
                do {
                  auVar134._0_4_ = (fVar38 * *(float *)*pauVar35 + fVar199) * *pfVar27 + *pfVar20;
                  auVar134._4_4_ =
                       (fVar69 * *(float *)(*pauVar35 + 4) + fVar200) * pfVar27[1] + pfVar20[1];
                  auVar134._8_4_ =
                       (fVar70 * *(float *)(*pauVar35 + 8) + fVar201) * pfVar27[2] + pfVar20[2];
                  auVar134._12_4_ =
                       (auVar93._12_4_ * *(float *)(*pauVar35 + 0xc) + fVar112) * pfVar27[3] +
                       pfVar20[3];
                  auVar134._16_4_ =
                       (fVar38 * *(float *)(*pauVar35 + 0x10) + fVar199) * pfVar27[4] + pfVar20[4];
                  auVar134._20_4_ =
                       (fVar69 * *(float *)(*pauVar35 + 0x14) + fVar200) * pfVar27[5] + pfVar20[5];
                  auVar134._24_4_ =
                       (fVar70 * *(float *)(*pauVar35 + 0x18) + fVar201) * pfVar27[6] + pfVar20[6];
                  auVar134._28_4_ = in_ZMM2._28_4_ + fVar112 + pfVar20[7];
                  in_ZMM2 = ZEXT3264(auVar134);
                  *pauVar35 = auVar134;
                  pauVar35 = pauVar35 + 1;
                  pfVar27 = pfVar27 + 8;
                  pfVar20 = pfVar20 + 8;
                  iVar21 = iVar21 + 8;
                  uVar33 = uVar30;
                } while (iVar21 <= (int)uVar29);
              }
              uVar25 = uVar33 | 4;
              while ((int)uVar25 <= (int)uVar29) {
                fVar113 = *(float *)(*pauVar35 + 4);
                fVar114 = *(float *)(*pauVar35 + 8);
                fVar138 = *(float *)(*pauVar35 + 0xc);
                fVar139 = pfVar27[1];
                fVar140 = pfVar27[2];
                fVar141 = pfVar27[3];
                fVar142 = pfVar20[1];
                fVar143 = pfVar20[2];
                fVar4 = pfVar20[3];
                *(float *)*pauVar35 = (fVar199 + fVar38 * *(float *)*pauVar35) * *pfVar27 + *pfVar20
                ;
                *(float *)(*pauVar35 + 4) = (fVar200 + fVar69 * fVar113) * fVar139 + fVar142;
                *(float *)(*pauVar35 + 8) = (fVar201 + fVar70 * fVar114) * fVar140 + fVar143;
                *(float *)(*pauVar35 + 0xc) = (fVar112 + auVar93._12_4_ * fVar138) * fVar141 + fVar4
                ;
                pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
                pfVar27 = pfVar27 + 4;
                pfVar20 = pfVar20 + 4;
                uVar25 = uVar33 + 8;
                uVar33 = uVar33 + 4;
              }
              if (uVar29 - uVar33 != 0 && (int)uVar33 <= (int)uVar29) {
                lVar18 = 0;
                do {
                  *(float *)(*pauVar35 + lVar18 * 4) =
                       (fVar37 * *(float *)(*pauVar35 + lVar18 * 4) + fVar71) * pfVar27[lVar18] +
                       pfVar20[lVar18];
                  lVar18 = lVar18 + 1;
                } while (uVar29 - uVar33 != (int)lVar18);
              }
            }
          }
          uVar34 = uVar34 + 1;
        } while (uVar34 != uVar23);
      }
    }
    else if ((iVar21 == 2) && (0 < (int)uVar30)) {
      uVar29 = iVar1 * iVar22;
      fVar36 = 1.0 / (float)iVar1;
      auVar92 = vshufps_avx(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36),0);
      uVar23 = uVar29 & 0xfffffff8;
      uVar34 = 0;
      auVar266 = ZEXT3264(_DAT_00557bc0);
      auVar167 = ZEXT3264(_DAT_00557be0);
      auVar168._8_8_ = 0x8000000000000000;
      auVar168._0_8_ = 0x8000000000000000;
      auVar123 = vpcmpeqd_avx(auVar123,auVar123);
      do {
        pauVar35 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar34 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar181 = ZEXT1664(ZEXT816(0) << 0x40);
        pauVar19 = pauVar35;
        uVar33 = 0;
        if (7 < (int)uVar29) {
          iVar21 = 8;
          do {
            auVar181 = ZEXT3264(CONCAT428(auVar181._28_4_ + *(float *)(*pauVar19 + 0x1c),
                                          CONCAT424(auVar181._24_4_ + *(float *)(*pauVar19 + 0x18),
                                                    CONCAT420(auVar181._20_4_ +
                                                              *(float *)(*pauVar19 + 0x14),
                                                              CONCAT416(auVar181._16_4_ +
                                                                        *(float *)(*pauVar19 + 0x10)
                                                                        ,CONCAT412(auVar181._12_4_ +
                                                                                   *(float *)(*
                                                  pauVar19 + 0xc),
                                                  CONCAT48(auVar181._8_4_ +
                                                           *(float *)(*pauVar19 + 8),
                                                           CONCAT44(auVar181._4_4_ +
                                                                    *(float *)(*pauVar19 + 4),
                                                                    auVar181._0_4_ +
                                                                    *(float *)*pauVar19))))))));
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar33 = uVar23;
          } while (iVar21 <= (int)uVar29);
        }
        uVar25 = uVar33 | 4;
        auVar187 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar38 = auVar187._0_4_;
          fVar69 = auVar187._4_4_;
          fVar70 = auVar187._8_4_;
          fVar71 = auVar187._12_4_;
          if ((int)uVar29 < (int)uVar25) break;
          auVar187._0_4_ = fVar38 + *(float *)*pauVar19;
          auVar187._4_4_ = fVar69 + *(float *)(*pauVar19 + 4);
          auVar187._8_4_ = fVar70 + *(float *)(*pauVar19 + 8);
          auVar187._12_4_ = fVar71 + *(float *)(*pauVar19 + 0xc);
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar25 = uVar33 + 8;
          uVar33 = uVar33 + 4;
        }
        auVar149 = ZEXT816(0) << 0x20;
        fVar37 = 0.0;
        auVar67 = auVar266._0_32_;
        if ((int)uVar33 < (int)uVar29) {
          uVar28 = CONCAT44(0,~uVar33 + uVar29);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar28;
          auVar171 = vpshufd_avx(auVar39,0x44);
          auVar149 = vorps_avx(auVar171,auVar168);
          auVar93 = vorps_avx(auVar171,auVar168);
          uVar26 = 0;
          auVar154 = ZEXT1664(ZEXT816(0) << 0x40);
          do {
            auVar234 = auVar154;
            auVar72._8_8_ = 0;
            auVar72._0_8_ = uVar26;
            auVar144 = vpshufd_avx(auVar72,0x44);
            auVar96._16_16_ = auVar144;
            auVar96._0_16_ = auVar144;
            auVar68 = vorps_avx(auVar67,auVar96);
            auVar235 = vorps_avx(auVar96,auVar167._0_32_);
            auVar144 = vorps_avx(auVar171,auVar168);
            auVar215._8_4_ = auVar235._24_4_;
            auVar215._0_8_ = auVar235._16_8_ ^ 0x8000000000000000;
            auVar215._12_4_ = auVar235._28_4_ ^ 0x80000000;
            auVar161 = vpcmpgtq_avx(auVar215,auVar144);
            auVar73._8_4_ = auVar235._8_4_;
            auVar236._8_4_ = auVar73._8_4_;
            auVar236._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
            auVar236._12_4_ = auVar235._12_4_ ^ 0x80000000;
            auVar56 = vpcmpgtq_avx(auVar236,auVar149);
            auVar56 = vpackssdw_avx(auVar56,auVar161);
            auVar246._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
            auVar246._8_4_ = auVar68._24_4_;
            auVar246._12_4_ = auVar68._28_4_ ^ 0x80000000;
            auVar124 = vpcmpgtq_avx(auVar246,auVar144);
            auVar247._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
            auVar247._8_4_ = auVar68._8_4_;
            auVar247._12_4_ = auVar68._12_4_ ^ 0x80000000;
            auVar144 = vpcmpgtq_avx(auVar247,auVar93);
            auVar144 = vpackssdw_avx(auVar144,auVar124);
            auVar144 = vpackssdw_avx(auVar144 ^ auVar123,auVar56 ^ auVar123);
            auVar56 = vpmovsxwd_avx(auVar144);
            auVar144 = vpunpckhwd_avx(auVar144,auVar144);
            auVar243._16_16_ = auVar144;
            auVar243._0_16_ = auVar56;
            auVar153 = vmaskmovps_avx(auVar243,*(undefined1 (*) [32])(*pauVar19 + uVar26 * 4));
            auVar223._0_4_ = auVar153._0_4_ + auVar234._0_4_;
            auVar223._4_4_ = auVar153._4_4_ + auVar234._4_4_;
            auVar223._8_4_ = auVar153._8_4_ + auVar234._8_4_;
            auVar223._12_4_ = auVar153._12_4_ + auVar234._12_4_;
            auVar228._16_4_ = auVar153._16_4_ + auVar234._16_4_;
            auVar228._0_16_ = auVar223;
            auVar228._20_4_ = auVar153._20_4_ + auVar234._20_4_;
            auVar228._24_4_ = auVar153._24_4_ + auVar234._24_4_;
            auVar228._28_4_ = auVar153._28_4_ + auVar234._28_4_;
            uVar26 = uVar26 + 8;
            auVar154 = ZEXT3264(auVar228);
          } while ((uVar28 + 8 & 0x1fffffff8) != uVar26);
          auVar149 = vorps_avx(auVar171,auVar168);
          auVar73._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
          auVar73._12_4_ = auVar235._12_4_ ^ 0x80000000;
          auVar149 = vpcmpgtq_avx(auVar73,auVar149);
          auVar93 = vpackssdw_avx(auVar149,auVar161);
          auVar149 = vorps_avx(auVar171,auVar168);
          auVar115._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
          auVar115._8_4_ = auVar68._8_4_;
          auVar115._12_4_ = auVar68._12_4_ ^ 0x80000000;
          auVar149 = vpcmpgtq_avx(auVar115,auVar149);
          auVar149 = vpackssdw_avx(auVar149,auVar124);
          auVar149 = vblendvps_avx(auVar234._0_16_,auVar223,auVar149 ^ auVar123);
          in_ZMM2 = ZEXT1664(auVar228._16_16_);
          auVar93 = vblendvps_avx(auVar234._16_16_,auVar228._16_16_,auVar93 ^ auVar123);
          auVar149 = vhaddps_avx(auVar93,auVar149);
          auVar149 = vhaddps_avx(auVar149,auVar149);
          auVar149 = vhaddps_avx(auVar149,auVar149);
          fVar37 = auVar149._0_4_;
          auVar149 = ZEXT816(0);
        }
        auVar154 = ZEXT1664(auVar149 << 0x20);
        local_b8 = auVar92._0_4_;
        fStack_b4 = auVar92._4_4_;
        fStack_b0 = auVar92._8_4_;
        fStack_ac = auVar92._12_4_;
        if (iVar22 == 8) {
          auVar175._0_4_ = auVar181._0_4_ * local_b8;
          auVar175._4_4_ = auVar181._4_4_ * fStack_b4;
          auVar175._8_4_ = auVar181._8_4_ * fStack_b0;
          auVar175._12_4_ = auVar181._12_4_ * fStack_ac;
          auVar182._16_4_ = auVar181._16_4_ * local_b8;
          auVar182._0_16_ = auVar175;
          auVar182._20_4_ = auVar181._20_4_ * fStack_b4;
          auVar182._28_36_ = auVar181._28_36_;
          auVar182._24_4_ = auVar181._24_4_ * fStack_b0;
          auVar57 = auVar182._0_32_;
          auVar181 = ZEXT3264(auVar57);
          auVar188 = vshufps_avx(auVar175,auVar175,0);
          bVar15 = true;
          bVar17 = false;
          auVar154 = ZEXT1664(auVar175);
          bVar16 = false;
        }
        else {
          if (iVar22 == 4) {
            auVar188._0_4_ = (fVar38 + auVar181._16_4_ + auVar181._0_4_) * local_b8;
            auVar188._4_4_ = (fVar69 + auVar181._20_4_ + auVar181._4_4_) * fStack_b4;
            auVar188._8_4_ = (fVar70 + auVar181._24_4_ + auVar181._8_4_) * fStack_b0;
            auVar188._12_4_ = (fVar71 + auVar181._28_4_ + auVar181._12_4_) * fStack_ac;
            bVar16 = true;
            bVar17 = false;
            auVar154 = ZEXT1664(auVar188);
            auVar149 = auVar188;
          }
          else {
            if (iVar22 != 1) {
              auVar149 = ZEXT816(0);
              auVar188 = ZEXT816(0) << 0x40;
            }
            else {
              auVar93 = vshufpd_avx(auVar187,auVar187,1);
              auVar149 = vhaddps_avx(auVar181._16_16_,auVar181._0_16_);
              auVar116._0_4_ = fVar38 + auVar93._0_4_;
              auVar116._4_4_ = fVar69 + auVar93._4_4_;
              auVar116._8_4_ = fVar70 + auVar93._8_4_;
              auVar116._12_4_ = fVar71 + auVar93._12_4_;
              in_ZMM2 = ZEXT1664(auVar116);
              auVar149 = vhaddps_avx(auVar149,auVar149);
              auVar93 = vmovshdup_avx(auVar116);
              auVar149 = vhaddps_avx(auVar149,auVar149);
              fVar38 = (auVar149._0_4_ + auVar93._0_4_ + auVar116._0_4_ + fVar37) * fVar36;
              auVar154 = ZEXT464((uint)fVar38);
              auVar149 = vblendps_avx(ZEXT416((uint)fVar38),_DAT_005573b0,0xe);
              auVar188 = vshufps_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38),0);
            }
            bVar17 = iVar22 == 1;
            bVar16 = false;
          }
          auVar181 = ZEXT1664(auVar149);
          auVar57._16_16_ = auVar188;
          auVar57._0_16_ = auVar188;
          bVar15 = false;
        }
        auVar202 = (undefined1  [36])0x0;
        pauVar19 = pauVar35;
        if ((int)uVar29 < 8) {
          auVar229 = SUB6432(ZEXT864(0),0);
          uVar33 = 0;
        }
        else {
          auVar234 = ZEXT864(0);
          iVar21 = 8;
          do {
            auVar68 = vsubps_avx(*pauVar19,auVar57);
            auVar229._0_4_ = auVar234._0_4_ + auVar68._0_4_ * auVar68._0_4_;
            auVar229._4_4_ = auVar234._4_4_ + auVar68._4_4_ * auVar68._4_4_;
            auVar229._8_4_ = auVar234._8_4_ + auVar68._8_4_ * auVar68._8_4_;
            auVar229._12_4_ = auVar234._12_4_ + auVar68._12_4_ * auVar68._12_4_;
            auVar229._16_4_ = auVar234._16_4_ + auVar68._16_4_ * auVar68._16_4_;
            auVar229._20_4_ = auVar234._20_4_ + auVar68._20_4_ * auVar68._20_4_;
            auVar229._24_4_ = auVar234._24_4_ + auVar68._24_4_ * auVar68._24_4_;
            auVar229._28_4_ = auVar234._28_4_ + auVar68._28_4_;
            auVar234 = ZEXT3264(auVar229);
            pauVar19 = pauVar19 + 1;
            iVar21 = iVar21 + 8;
            uVar33 = uVar23;
          } while (iVar21 <= (int)uVar29);
        }
        uVar25 = uVar33 | 4;
        auVar237 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar38 = auVar237._4_4_;
          fVar69 = auVar237._8_4_;
          fVar70 = auVar237._12_4_;
          if ((int)uVar29 < (int)uVar25) break;
          auVar149 = vsubps_avx(*(undefined1 (*) [16])*pauVar19,auVar188);
          auVar237._0_4_ = auVar237._0_4_ + auVar149._0_4_ * auVar149._0_4_;
          auVar237._4_4_ = fVar38 + auVar149._4_4_ * auVar149._4_4_;
          auVar237._8_4_ = fVar69 + auVar149._8_4_ * auVar149._8_4_;
          auVar237._12_4_ = fVar70 + auVar149._12_4_ * auVar149._12_4_;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + 0x10);
          uVar25 = uVar33 + 8;
          uVar33 = uVar33 + 4;
        }
        fVar71 = 0.0;
        if ((int)uVar33 < (int)uVar29) {
          uVar28 = CONCAT44(0,~uVar33 + uVar29);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar28;
          auVar171 = vpshufd_avx(auVar40,0x44);
          auVar202 = ZEXT436(auVar171._12_4_);
          auVar144 = auVar154._0_16_;
          auVar149 = vshufps_avx(auVar144,auVar144,0);
          auVar263._16_16_ = auVar149;
          auVar263._0_16_ = auVar149;
          auVar149 = vorps_avx(auVar171,auVar168);
          auVar93 = vorps_avx(auVar171,auVar168);
          uVar26 = 0;
          auVar266 = ZEXT464(0) << 0x40;
          do {
            auVar154 = auVar266;
            auVar74._8_8_ = 0;
            auVar74._0_8_ = uVar26;
            auVar56 = vpshufd_avx(auVar74,0x44);
            auVar97._16_16_ = auVar56;
            auVar97._0_16_ = auVar56;
            auVar68 = vorps_avx(auVar97,auVar67);
            auVar235 = vorps_avx(auVar97,auVar167._0_32_);
            auVar56 = vorps_avx(auVar171,auVar168);
            auVar216._0_8_ = auVar235._16_8_ ^ 0x8000000000000000;
            auVar216._8_4_ = auVar235._24_4_;
            auVar216._12_4_ = auVar235._28_4_ ^ 0x80000000;
            auVar124 = vpcmpgtq_avx(auVar216,auVar56);
            auVar248._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
            auVar75._8_4_ = auVar235._8_4_;
            auVar248._8_4_ = auVar75._8_4_;
            auVar248._12_4_ = auVar235._12_4_ ^ 0x80000000;
            auVar161 = vpcmpgtq_avx(auVar248,auVar149);
            auVar161 = vpackssdw_avx(auVar161,auVar124);
            auVar155._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
            auVar155._8_4_ = auVar68._24_4_;
            auVar155._12_4_ = auVar68._28_4_ ^ 0x80000000;
            auVar148 = vpcmpgtq_avx(auVar155,auVar56);
            auVar156._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
            auVar117._8_4_ = auVar68._8_4_;
            auVar156._8_4_ = auVar117._8_4_;
            auVar156._12_4_ = auVar68._12_4_ ^ 0x80000000;
            auVar56 = vpcmpgtq_avx(auVar156,auVar93);
            auVar56 = vpackssdw_avx(auVar56,auVar148);
            auVar56 = vpackssdw_avx(auVar56 ^ auVar123,auVar161 ^ auVar123);
            auVar161 = vpmovsxwd_avx(auVar56);
            auVar56 = vpunpckhwd_avx(auVar56,auVar56);
            auVar164._16_16_ = auVar56;
            auVar164._0_16_ = auVar161;
            auVar153 = vmaskmovps_avx(auVar164,*(undefined1 (*) [32])(*pauVar19 + uVar26 * 4));
            auVar153 = vsubps_avx(auVar153,auVar263);
            auVar249._0_4_ = auVar153._0_4_ * auVar153._0_4_ + auVar154._0_4_;
            auVar249._4_4_ = auVar153._4_4_ * auVar153._4_4_ + auVar154._4_4_;
            auVar249._8_4_ = auVar153._8_4_ * auVar153._8_4_ + auVar154._8_4_;
            auVar249._12_4_ = auVar153._12_4_ * auVar153._12_4_ + auVar154._12_4_;
            auVar260._16_4_ = auVar153._16_4_ * auVar153._16_4_ + auVar154._16_4_;
            auVar260._0_16_ = auVar249;
            auVar260._20_4_ = auVar153._20_4_ * auVar153._20_4_ + auVar154._20_4_;
            auVar260._24_4_ = auVar153._24_4_ * auVar153._24_4_ + auVar154._24_4_;
            auVar260._28_4_ = auVar153._28_4_ + auVar154._28_4_;
            auVar167 = ZEXT3264(_DAT_00557be0);
            uVar26 = uVar26 + 8;
            auVar266 = ZEXT3264(auVar260);
          } while ((uVar28 + 8 & 0x1fffffff8) != uVar26);
          auVar149 = vorps_avx(auVar171,auVar168);
          auVar75._0_8_ = auVar235._0_8_ ^ 0x8000000000000000;
          auVar75._12_4_ = auVar235._12_4_ ^ 0x80000000;
          auVar149 = vpcmpgtq_avx(auVar75,auVar149);
          auVar93 = vpackssdw_avx(auVar149,auVar124);
          auVar149 = vorps_avx(auVar171,auVar168);
          auVar117._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
          auVar117._12_4_ = auVar68._12_4_ ^ 0x80000000;
          auVar149 = vpcmpgtq_avx(auVar117,auVar149);
          auVar149 = vpackssdw_avx(auVar149,auVar148);
          auVar149 = vblendvps_avx(auVar154._0_16_,auVar249,auVar149 ^ auVar123);
          in_ZMM2 = ZEXT1664(auVar260._16_16_);
          auVar93 = vblendvps_avx(auVar154._16_16_,auVar260._16_16_,auVar93 ^ auVar123);
          auVar149 = vhaddps_avx(auVar93,auVar149);
          auVar149 = vhaddps_avx(auVar149,auVar149);
          auVar149 = vhaddps_avx(auVar149,auVar149);
          fVar71 = auVar149._0_4_;
          auVar266 = ZEXT3264(auVar67);
          auVar181 = ZEXT3264(auVar181._0_32_);
          auVar154 = ZEXT1664(auVar144);
        }
        auVar149 = ZEXT416((uint)*(float *)(&this->field_0xd4 + (long)pp_Var2[-3]));
        auVar98 = auVar181._0_32_;
        if (bVar15) {
          auVar197._0_4_ = auVar229._0_4_ * local_b8;
          auVar197._4_4_ = auVar229._4_4_ * fStack_b4;
          auVar197._8_4_ = auVar229._8_4_ * fStack_b0;
          auVar197._12_4_ = auVar229._12_4_ * fStack_ac;
          auVar197._16_4_ = auVar229._16_4_ * local_b8;
          auVar197._20_4_ = auVar229._20_4_ * fStack_b4;
          auVar197._24_4_ = auVar229._24_4_ * fStack_b0;
          auVar197._28_36_ = auVar202;
          auVar67 = auVar197._0_32_;
        }
        else {
          auVar67 = ZEXT1632(ZEXT816(0) << 0x40);
        }
        if (bVar16) {
          auVar237._0_4_ = auVar237._0_4_ + auVar229._0_4_ + auVar229._16_4_;
          auVar237._4_4_ = fVar38 + auVar229._4_4_ + auVar229._20_4_;
          auVar237._8_4_ = fVar69 + auVar229._8_4_ + auVar229._24_4_;
          auVar237._12_4_ = fVar70 + auVar229._12_4_ + auVar229._28_4_;
          auVar67 = vblendps_avx(auVar67,ZEXT1632(CONCAT412(auVar237._12_4_ * fStack_ac,
                                                            CONCAT48(auVar237._8_4_ * fStack_b0,
                                                                     CONCAT44(auVar237._4_4_ *
                                                                              fStack_b4,
                                                                              auVar237._0_4_ *
                                                                              local_b8)))),0xf);
        }
        if (bVar17) {
          auVar93 = vshufpd_avx(auVar237,auVar237,1);
          auVar76._0_4_ = auVar237._0_4_ + auVar93._0_4_;
          auVar76._4_4_ = auVar237._4_4_ + auVar93._4_4_;
          auVar76._8_4_ = auVar237._8_4_ + auVar93._8_4_;
          auVar76._12_4_ = auVar237._12_4_ + auVar93._12_4_;
          auVar93 = vhaddps_avx(auVar229._16_16_,auVar229._0_16_);
          auVar171 = vmovshdup_avx(auVar76);
          in_ZMM2 = ZEXT1664(auVar171);
          auVar93 = vhaddps_avx(auVar93,auVar93);
          auVar93 = vhaddps_avx(auVar93,auVar93);
          auVar67 = vblendps_avx(auVar67,ZEXT432((uint)((fVar71 + auVar93._0_4_ + auVar76._0_4_ +
                                                        auVar171._0_4_) * fVar36)),1);
        }
        fVar38 = auVar67._0_4_;
        auVar193 = auVar67._0_28_;
        if (iVar22 == 1) {
          fVar38 = fVar38 + *(float *)(&this->field_0xd4 + (long)pp_Var2[-3]);
          auVar149 = vrsqrtss_avx(ZEXT416((uint)fVar38),ZEXT416((uint)fVar38));
          fVar69 = auVar149._0_4_;
          fVar38 = fVar69 * -0.5 * (fVar38 * fVar69 * fVar69 + -3.0);
          auVar67 = vblendps_avx(auVar67,ZEXT432((uint)fVar38),1);
          auVar193 = auVar67._0_28_;
          auVar98 = vblendps_avx(auVar98,ZEXT432((uint)(fVar38 * -auVar154._0_4_)),1);
        }
        else if (iVar22 == 4) {
          auVar149 = vshufps_avx(auVar149,auVar149,0);
          auVar41._0_4_ = fVar38 + auVar149._0_4_;
          auVar41._4_4_ = auVar67._4_4_ + auVar149._4_4_;
          auVar41._8_4_ = auVar67._8_4_ + auVar149._8_4_;
          auVar41._12_4_ = auVar67._12_4_ + auVar149._12_4_;
          auVar149 = vrsqrtps_avx(auVar41);
          fVar38 = auVar149._0_4_;
          fVar69 = auVar149._4_4_;
          fVar70 = auVar149._8_4_;
          fVar71 = auVar149._12_4_;
          in_ZMM2 = ZEXT1664(CONCAT412(0xbf000000,CONCAT48(0xbf000000,0xbf000000bf000000)));
          fVar38 = fVar38 * -0.5 * (auVar41._0_4_ * fVar38 * fVar38 + -3.0);
          fVar69 = fVar69 * -0.5 * (auVar41._4_4_ * fVar69 * fVar69 + -3.0);
          fVar70 = fVar70 * -0.5 * (auVar41._8_4_ * fVar70 * fVar70 + -3.0);
          fVar71 = fVar71 * -0.5 * (auVar41._12_4_ * fVar71 * fVar71 + -3.0);
          auVar67 = vblendps_avx(auVar67,ZEXT1632(CONCAT412(fVar71,CONCAT48(fVar70,CONCAT44(fVar69,
                                                  fVar38)))),0xf);
          auVar193 = auVar67._0_28_;
          auVar98 = vblendps_avx(auVar98,ZEXT1632(CONCAT412(fVar71 * -auVar181._12_4_,
                                                            CONCAT48(fVar70 * -auVar181._8_4_,
                                                                     CONCAT44(fVar69 * -auVar181.
                                                  _4_4_,fVar38 * -auVar181._0_4_)))),0xf);
        }
        else if (iVar22 == 8) {
          auVar149 = vshufps_avx(auVar149,auVar149,0);
          auVar58._0_4_ = fVar38 + auVar149._0_4_;
          auVar58._4_4_ = auVar67._4_4_ + auVar149._4_4_;
          auVar58._8_4_ = auVar67._8_4_ + auVar149._8_4_;
          auVar58._12_4_ = auVar67._12_4_ + auVar149._12_4_;
          auVar58._16_4_ = auVar67._16_4_ + auVar149._0_4_;
          auVar58._20_4_ = auVar67._20_4_ + auVar149._4_4_;
          auVar58._24_4_ = auVar67._24_4_ + auVar149._8_4_;
          auVar58._28_4_ = auVar67._28_4_ + auVar149._12_4_;
          auVar67 = vrsqrtps_avx(auVar58);
          fVar38 = auVar67._0_4_;
          fVar69 = auVar67._4_4_;
          fVar70 = auVar67._8_4_;
          fVar71 = auVar67._12_4_;
          fVar37 = auVar67._16_4_;
          fVar199 = auVar67._20_4_;
          fVar200 = auVar67._24_4_;
          in_ZMM2 = ZEXT3264(CONCAT428(0xbf000000,
                                       CONCAT424(0xbf000000,
                                                 CONCAT420(0xbf000000,
                                                           CONCAT416(0xbf000000,
                                                                     CONCAT412(0xbf000000,
                                                                               CONCAT48(0xbf000000,
                                                                                                                                                                                
                                                  0xbf000000bf000000)))))));
          auVar193._0_4_ = fVar38 * -0.5 * (auVar58._0_4_ * fVar38 * fVar38 + -3.0);
          auVar193._4_4_ = fVar69 * -0.5 * (auVar58._4_4_ * fVar69 * fVar69 + -3.0);
          auVar193._8_4_ = fVar70 * -0.5 * (auVar58._8_4_ * fVar70 * fVar70 + -3.0);
          auVar193._12_4_ = fVar71 * -0.5 * (auVar58._12_4_ * fVar71 * fVar71 + -3.0);
          auVar193._16_4_ = fVar37 * -0.5 * (auVar58._16_4_ * fVar37 * fVar37 + -3.0);
          auVar193._20_4_ = fVar199 * -0.5 * (auVar58._20_4_ * fVar199 * fVar199 + -3.0);
          auVar193._24_4_ = fVar200 * -0.5 * (auVar58._24_4_ * fVar200 * fVar200 + -3.0);
          auVar183._0_4_ = auVar193._0_4_ * -auVar181._0_4_;
          auVar183._4_4_ = auVar193._4_4_ * -auVar181._4_4_;
          auVar183._8_4_ = auVar193._8_4_ * -auVar181._8_4_;
          auVar183._12_4_ = auVar193._12_4_ * -auVar181._12_4_;
          auVar183._16_4_ = auVar193._16_4_ * -auVar181._16_4_;
          auVar183._20_4_ = auVar193._20_4_ * -auVar181._20_4_;
          auVar183._28_36_ = auVar181._28_36_;
          auVar183._24_4_ = auVar193._24_4_ * -auVar181._24_4_;
          auVar98 = auVar183._0_32_;
        }
        auVar93 = auVar193._0_16_;
        auVar149 = auVar98._0_16_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
          auVar171 = auVar93;
          auVar144 = auVar149;
          if (!bVar16) {
            auVar171 = vshufps_avx(auVar93,auVar93,0);
            auVar144 = vshufps_avx(auVar149,auVar149,0);
          }
          if (!bVar15) {
            auVar59._16_16_ = auVar171;
            auVar59._0_16_ = auVar171;
            auVar193 = auVar59._0_28_;
            auVar98._16_16_ = auVar144;
            auVar98._0_16_ = auVar144;
          }
          uVar33 = 0;
          if (7 < (int)uVar29) {
            iVar21 = 8;
            do {
              auVar129._0_4_ = auVar193._0_4_ * *(float *)*pauVar35 + auVar98._0_4_;
              auVar129._4_4_ = auVar193._4_4_ * *(float *)(*pauVar35 + 4) + auVar98._4_4_;
              auVar129._8_4_ = auVar193._8_4_ * *(float *)(*pauVar35 + 8) + auVar98._8_4_;
              auVar129._12_4_ = auVar193._12_4_ * *(float *)(*pauVar35 + 0xc) + auVar98._12_4_;
              auVar129._16_4_ = auVar193._16_4_ * *(float *)(*pauVar35 + 0x10) + auVar98._16_4_;
              auVar129._20_4_ = auVar193._20_4_ * *(float *)(*pauVar35 + 0x14) + auVar98._20_4_;
              auVar129._24_4_ = auVar193._24_4_ * *(float *)(*pauVar35 + 0x18) + auVar98._24_4_;
              auVar129._28_4_ = in_ZMM2._28_4_ + auVar98._28_4_;
              in_ZMM2 = ZEXT3264(auVar129);
              *pauVar35 = auVar129;
              pauVar35 = pauVar35 + 1;
              iVar21 = iVar21 + 8;
              uVar33 = uVar23;
            } while (iVar21 <= (int)uVar29);
          }
          uVar25 = uVar33 | 4;
          while ((int)uVar25 <= (int)uVar29) {
            fVar38 = *(float *)(*pauVar35 + 4);
            fVar69 = *(float *)(*pauVar35 + 8);
            fVar70 = *(float *)(*pauVar35 + 0xc);
            *(float *)*pauVar35 = auVar144._0_4_ + auVar171._0_4_ * *(float *)*pauVar35;
            *(float *)(*pauVar35 + 4) = auVar144._4_4_ + auVar171._4_4_ * fVar38;
            *(float *)(*pauVar35 + 8) = auVar144._8_4_ + auVar171._8_4_ * fVar69;
            *(float *)(*pauVar35 + 0xc) = auVar144._12_4_ + auVar171._12_4_ * fVar70;
            pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
            uVar25 = uVar33 + 8;
            uVar33 = uVar33 + 4;
          }
          if ((int)uVar33 < (int)uVar29) {
            uVar28 = CONCAT44(0,~uVar33 + uVar29);
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar28;
            auVar171 = vpshufd_avx(auVar42,0x44);
            auVar144 = vshufps_avx(auVar93,auVar93,0);
            auVar56 = vshufps_avx(auVar149,auVar149,0);
            auVar149 = vorps_avx(auVar171,auVar168);
            auVar93 = vorps_avx(auVar171,auVar168);
            in_ZMM2 = ZEXT1664(auVar93);
            uVar26 = 0;
            do {
              auVar77._8_8_ = 0;
              auVar77._0_8_ = uVar26;
              auVar161 = vpshufd_avx(auVar77,0x44);
              auVar99._16_16_ = auVar161;
              auVar99._0_16_ = auVar161;
              auVar67 = vorps_avx(auVar266._0_32_,auVar99);
              auVar68 = vorps_avx(auVar99,auVar167._0_32_);
              auVar161 = vorps_avx(auVar171,auVar168);
              auVar203._0_8_ = auVar68._16_8_ ^ 0x8000000000000000;
              auVar203._8_4_ = auVar68._24_4_;
              auVar203._12_4_ = auVar68._28_4_ ^ 0x80000000;
              auVar124 = vpcmpgtq_avx(auVar203,auVar161);
              auVar78._0_8_ = auVar68._0_8_ ^ 0x8000000000000000;
              auVar78._8_4_ = auVar68._8_4_;
              auVar78._12_4_ = auVar68._12_4_ ^ 0x80000000;
              auVar148 = vpcmpgtq_avx(auVar78,auVar149);
              auVar124 = vpackssdw_avx(auVar148,auVar124);
              auVar204._0_8_ = auVar67._16_8_ ^ 0x8000000000000000;
              auVar204._8_4_ = auVar67._24_4_;
              auVar204._12_4_ = auVar67._28_4_ ^ 0x80000000;
              auVar161 = vpcmpgtq_avx(auVar204,auVar161);
              auVar145._0_8_ = auVar67._0_8_ ^ 0x8000000000000000;
              auVar145._8_4_ = auVar67._8_4_;
              auVar145._12_4_ = auVar67._12_4_ ^ 0x80000000;
              auVar148 = vpcmpgtq_avx(auVar145,auVar93);
              auVar161 = vpackssdw_avx(auVar148,auVar161);
              auVar167 = ZEXT3264(_DAT_00557be0);
              auVar161 = vpackssdw_avx(auVar161 ^ auVar123,auVar124 ^ auVar123);
              auVar124 = vpmovsxwd_avx(auVar161);
              auVar161 = vpunpckhwd_avx(auVar161,auVar161);
              auVar100._16_16_ = auVar161;
              auVar100._0_16_ = auVar124;
              auVar67 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])(*pauVar35 + uVar26 * 4));
              auVar150._0_4_ = auVar144._0_4_ * auVar67._0_4_ + auVar56._0_4_;
              auVar150._4_4_ = auVar144._4_4_ * auVar67._4_4_ + auVar56._4_4_;
              auVar150._8_4_ = auVar144._8_4_ * auVar67._8_4_ + auVar56._8_4_;
              auVar150._12_4_ = auVar144._12_4_ * auVar67._12_4_ + auVar56._12_4_;
              auVar150._16_4_ = auVar144._0_4_ * auVar67._16_4_ + auVar56._0_4_;
              auVar150._20_4_ = auVar144._4_4_ * auVar67._20_4_ + auVar56._4_4_;
              auVar150._24_4_ = auVar144._8_4_ * auVar67._24_4_ + auVar56._8_4_;
              auVar150._28_4_ = auVar67._28_4_ + auVar56._12_4_;
              auVar67 = vmaskmovps_avx(auVar100,auVar150);
              *(undefined1 (*) [32])(*pauVar35 + uVar26 * 4) = auVar67;
              uVar26 = uVar26 + 8;
            } while ((uVar28 + 8 & 0x1fffffff8) != uVar26);
          }
        }
        else {
          fVar37 = auVar193._0_4_;
          fVar199 = auVar193._4_4_;
          fVar200 = auVar193._8_4_;
          fVar201 = auVar193._12_4_;
          fVar71 = auVar98._0_4_;
          fVar38 = auVar98._4_4_;
          fVar69 = auVar98._8_4_;
          fVar70 = auVar98._12_4_;
          pfVar20 = pfVar32;
          pfVar27 = pfVar24;
          if (bVar15 && 7 < (int)uVar29) {
            iVar21 = 8;
            do {
              fVar112 = *pfVar20;
              fVar113 = *pfVar27;
              fVar114 = fVar37 * *(float *)*pauVar35 + fVar71;
              fVar138 = fVar199 * *(float *)(*pauVar35 + 4) + fVar38;
              fVar139 = fVar200 * *(float *)(*pauVar35 + 8) + fVar69;
              fVar140 = fVar201 * *(float *)(*pauVar35 + 0xc) + fVar70;
              fVar141 = auVar193._16_4_ * *(float *)(*pauVar35 + 0x10) + auVar98._16_4_;
              fVar142 = auVar193._20_4_ * *(float *)(*pauVar35 + 0x14) + auVar98._20_4_;
              fVar143 = auVar193._24_4_ * *(float *)(*pauVar35 + 0x18) + auVar98._24_4_;
              in_ZMM2 = ZEXT3264(CONCAT428(in_ZMM2._28_4_ + auVar98._28_4_,
                                           CONCAT424(fVar143,CONCAT420(fVar142,CONCAT416(fVar141,
                                                  CONCAT412(fVar140,CONCAT48(fVar139,CONCAT44(
                                                  fVar138,fVar114))))))));
              *(float *)*pauVar35 = fVar112 * fVar114 + fVar113;
              *(float *)(*pauVar35 + 4) = fVar112 * fVar138 + fVar113;
              *(float *)(*pauVar35 + 8) = fVar112 * fVar139 + fVar113;
              *(float *)(*pauVar35 + 0xc) = fVar112 * fVar140 + fVar113;
              *(float *)(*pauVar35 + 0x10) = fVar112 * fVar141 + fVar113;
              *(float *)(*pauVar35 + 0x14) = fVar112 * fVar142 + fVar113;
              *(float *)(*pauVar35 + 0x18) = fVar112 * fVar143 + fVar113;
              *(float *)(*pauVar35 + 0x1c) = fVar112 + fVar113;
              pauVar35 = pauVar35 + 1;
              pfVar20 = pfVar20 + 1;
              pfVar27 = pfVar27 + 1;
              iVar21 = iVar21 + 8;
            } while (iVar21 <= (int)uVar29);
          }
          if (bVar16) {
            iVar21 = 4;
            if (7 < (int)uVar29) {
              iVar21 = 8;
              do {
                fVar112 = *pfVar20;
                fVar113 = pfVar20[1];
                fVar114 = *pfVar27;
                fVar138 = pfVar27[1];
                auVar127._0_4_ = fVar114 + fVar112 * (fVar37 * *(float *)*pauVar35 + fVar71);
                auVar127._4_4_ = fVar114 + fVar112 * (fVar199 * *(float *)(*pauVar35 + 4) + fVar38);
                auVar127._8_4_ = fVar114 + fVar112 * (fVar200 * *(float *)(*pauVar35 + 8) + fVar69);
                auVar127._12_4_ =
                     fVar114 + fVar112 * (fVar201 * *(float *)(*pauVar35 + 0xc) + fVar70);
                auVar127._16_4_ =
                     fVar138 + fVar113 * (fVar37 * *(float *)(*pauVar35 + 0x10) + fVar71);
                auVar127._20_4_ =
                     fVar138 + fVar113 * (fVar199 * *(float *)(*pauVar35 + 0x14) + fVar38);
                auVar127._24_4_ =
                     fVar138 + fVar113 * (fVar200 * *(float *)(*pauVar35 + 0x18) + fVar69);
                auVar127._28_4_ = fVar138 + fVar113;
                in_ZMM2 = ZEXT3264(auVar127);
                *pauVar35 = auVar127;
                pauVar35 = pauVar35 + 1;
                pfVar20 = pfVar20 + 2;
                pfVar27 = pfVar27 + 2;
                iVar21 = iVar21 + 8;
              } while (iVar21 <= (int)uVar29);
              auVar167 = ZEXT3264(_DAT_00557be0);
              iVar21 = uVar23 + 4;
            }
            for (; iVar21 <= (int)uVar29; iVar21 = iVar21 + 4) {
              fVar112 = *pfVar20;
              fVar113 = *pfVar27;
              fVar114 = fVar37 * *(float *)*pauVar35 + fVar71;
              fVar138 = fVar199 * *(float *)(*pauVar35 + 4) + fVar38;
              fVar139 = fVar200 * *(float *)(*pauVar35 + 8) + fVar69;
              fVar140 = fVar201 * *(float *)(*pauVar35 + 0xc) + fVar70;
              in_ZMM2 = ZEXT1664(CONCAT412(fVar140,CONCAT48(fVar139,CONCAT44(fVar138,fVar114))));
              *(float *)*pauVar35 = fVar112 * fVar114 + fVar113;
              *(float *)(*pauVar35 + 4) = fVar112 * fVar138 + fVar113;
              *(float *)(*pauVar35 + 8) = fVar112 * fVar139 + fVar113;
              *(float *)(*pauVar35 + 0xc) = fVar112 * fVar140 + fVar113;
              pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
              pfVar20 = pfVar20 + 1;
              pfVar27 = pfVar27 + 1;
            }
          }
          if (bVar17) {
            auVar93 = vshufps_avx(auVar93,auVar93,0);
            auVar149 = vshufps_avx(auVar149,auVar149,0);
            fVar199 = auVar149._0_4_;
            fVar200 = auVar149._4_4_;
            fVar201 = auVar149._8_4_;
            fVar112 = auVar149._12_4_;
            fVar38 = auVar93._0_4_;
            fVar69 = auVar93._4_4_;
            fVar70 = auVar93._8_4_;
            uVar33 = 0;
            if (7 < (int)uVar29) {
              iVar21 = 8;
              do {
                auVar128._0_4_ = (fVar38 * *(float *)*pauVar35 + fVar199) * *pfVar20 + *pfVar27;
                auVar128._4_4_ =
                     (fVar69 * *(float *)(*pauVar35 + 4) + fVar200) * pfVar20[1] + pfVar27[1];
                auVar128._8_4_ =
                     (fVar70 * *(float *)(*pauVar35 + 8) + fVar201) * pfVar20[2] + pfVar27[2];
                auVar128._12_4_ =
                     (auVar93._12_4_ * *(float *)(*pauVar35 + 0xc) + fVar112) * pfVar20[3] +
                     pfVar27[3];
                auVar128._16_4_ =
                     (fVar38 * *(float *)(*pauVar35 + 0x10) + fVar199) * pfVar20[4] + pfVar27[4];
                auVar128._20_4_ =
                     (fVar69 * *(float *)(*pauVar35 + 0x14) + fVar200) * pfVar20[5] + pfVar27[5];
                auVar128._24_4_ =
                     (fVar70 * *(float *)(*pauVar35 + 0x18) + fVar201) * pfVar20[6] + pfVar27[6];
                auVar128._28_4_ = in_ZMM2._28_4_ + fVar112 + pfVar27[7];
                in_ZMM2 = ZEXT3264(auVar128);
                *pauVar35 = auVar128;
                pauVar35 = pauVar35 + 1;
                pfVar20 = pfVar20 + 8;
                pfVar27 = pfVar27 + 8;
                iVar21 = iVar21 + 8;
                uVar33 = uVar23;
              } while (iVar21 <= (int)uVar29);
            }
            uVar25 = uVar33 | 4;
            while ((int)uVar25 <= (int)uVar29) {
              fVar113 = *(float *)(*pauVar35 + 4);
              fVar114 = *(float *)(*pauVar35 + 8);
              fVar138 = *(float *)(*pauVar35 + 0xc);
              fVar139 = pfVar20[1];
              fVar140 = pfVar20[2];
              fVar141 = pfVar20[3];
              fVar142 = pfVar27[1];
              fVar143 = pfVar27[2];
              fVar4 = pfVar27[3];
              *(float *)*pauVar35 = (fVar199 + fVar38 * *(float *)*pauVar35) * *pfVar20 + *pfVar27;
              *(float *)(*pauVar35 + 4) = (fVar200 + fVar69 * fVar113) * fVar139 + fVar142;
              *(float *)(*pauVar35 + 8) = (fVar201 + fVar70 * fVar114) * fVar140 + fVar143;
              *(float *)(*pauVar35 + 0xc) = (fVar112 + auVar93._12_4_ * fVar138) * fVar141 + fVar4;
              pauVar35 = (undefined1 (*) [32])(*pauVar35 + 0x10);
              pfVar20 = pfVar20 + 4;
              pfVar27 = pfVar27 + 4;
              uVar25 = uVar33 + 8;
              uVar33 = uVar33 + 4;
            }
            if (uVar29 - uVar33 != 0 && (int)uVar33 <= (int)uVar29) {
              lVar18 = 0;
              do {
                *(float *)(*pauVar35 + lVar18 * 4) =
                     (fVar37 * *(float *)(*pauVar35 + lVar18 * 4) + fVar71) * pfVar20[lVar18] +
                     pfVar27[lVar18];
                lVar18 = lVar18 + 1;
              } while (uVar29 - uVar33 != (int)lVar18);
            }
          }
        }
        uVar34 = uVar34 + 1;
      } while (uVar34 != uVar30);
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}